

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  IROp1 *pIVar1;
  char *pcVar2;
  char cVar3;
  uint8_t uVar4;
  ushort uVar5;
  short sVar6;
  ushort uVar7;
  CTypeID id;
  ExitNo exitno;
  SnapShot *pSVar8;
  uint64_t uVar9;
  SnapEntry *pSVar10;
  GCtrace *T_00;
  undefined1 uVar11;
  MCode *pMVar12;
  TValue TVar13;
  byte bVar14;
  Reg RVar15;
  CTInfo CVar16;
  Reg RVar17;
  TRef TVar18;
  MSize MVar19;
  MCode *p_1;
  uint uVar24;
  GCtrace *pGVar20;
  IRIns *pIVar21;
  byte *pbVar22;
  MCode MVar23;
  undefined4 uVar25;
  MCode *p;
  long lVar26;
  uint16_t *puVar27;
  void *addr;
  code *pcVar28;
  BCReg BVar29;
  x86Shift xs;
  IRCallID id_00;
  IRRef ref;
  ulong uVar30;
  IRIns u64;
  IRIns IVar31;
  byte *pbVar32;
  byte *pbVar33;
  uint *u64_00;
  CCallInfo *pCVar34;
  RegSet blocked;
  x86Op xVar35;
  IRIns *unaff_RBP;
  undefined7 uVar36;
  byte bVar37;
  IRRef1 IVar38;
  BCReg BVar39;
  int iVar40;
  code *target;
  int32_t iVar41;
  long lVar42;
  MCode MVar43;
  MCode MVar44;
  uint uVar45;
  RegSet RVar46;
  uint uVar47;
  ulong uVar48;
  ushort *puVar49;
  byte bVar50;
  Reg dest;
  RegSet RVar51;
  undefined4 uVar52;
  IRIns IVar53;
  uint uVar54;
  int iVar55;
  IRIns *pIVar56;
  bool bVar57;
  bool bVar58;
  CTSize sz;
  IRRef args [64];
  ushort auStack_1037a [32549];
  code *pcStack_530;
  IRIns local_528;
  uint local_520;
  int local_51c;
  ulong local_518;
  ASMState local_510;
  IRIns *local_180;
  IRIns *local_178;
  uint local_16c;
  ulong local_168;
  jit_State *local_160;
  GCtrace *local_158;
  IRIns local_150;
  uint32_t local_148;
  global_State *local_140;
  TValue local_138;
  uint32_t local_130;
  undefined4 local_12c;
  
  uVar30 = (ulong)(T->nins - 1);
  cVar3 = *(char *)((long)T->ir + uVar30 * 8 + 5);
  if ((cVar3 == '\x14') || (cVar3 == '\f')) {
    while ((cVar3 = *(char *)((long)T->ir + uVar30 * 8 + -3), cVar3 == '\x14' || (cVar3 == '\f'))) {
      uVar30 = uVar30 - 1;
    }
    T->nins = (IRRef)uVar30;
  }
  uVar54 = (J->cur).nins;
  if (J->irtoplim <= uVar54) {
    pcStack_530 = (code *)0x13be40;
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar54 + 1;
  (J->cur).ir[uVar54] = (IRIns)0xc0000000000;
  pcStack_530 = (code *)0x1369b6;
  local_510.J = J;
  local_510.orignins = uVar54;
  local_510.T = T;
  pGVar20 = lj_trace_alloc(J->L,T);
  J->curfinal = pGVar20;
  local_510.flags = J->flags;
  local_510.loopref = J->loopref;
  local_510.realign = (byte *)0x0;
  local_510.loopinv = 0;
  if ((ulong)J->parent == 0) {
    local_510.parent = (GCtrace *)0x0;
  }
  else {
    local_510.parent = (GCtrace *)J->trace[J->parent].gcptr64;
  }
  pcStack_530 = (code *)0x136a1f;
  local_510.mcp = lj_mcode_reserve(J,&local_510.mcbot);
  local_510.mctoporig = local_510.mcp;
  local_510.mctop = local_510.mcp;
  local_510.mclim = local_510.mcbot + 0x40;
  uVar5 = (local_510.T)->nsnap;
  if (0x1ff < uVar5) {
    pcStack_530 = (code *)0x13be9c;
    lj_trace_err(local_510.J,LJ_TRERR_SNAPOV);
  }
  if (uVar5 != 0) {
    MVar23 = '\x01';
    uVar30 = 0;
    do {
      pMVar12 = local_510.mcbot;
      if ((local_510.J)->exitstubgroup[uVar30] == (MCode *)0x0) {
        if (local_510.mcp <= local_510.mcbot + 0x8d) goto LAB_0013bc67;
        *local_510.mcbot = 'j';
        local_510.mcbot[1] = (MCode)((int)uVar30 << 5);
        MVar43 = 'z';
        lVar26 = 0;
        MVar44 = MVar23;
        do {
          lVar42 = lVar26;
          local_510.mcbot[lVar42 + 2] = 0xeb;
          local_510.mcbot[lVar42 + 3] = MVar43;
          local_510.mcbot[lVar42 + 4] = 'j';
          local_510.mcbot[lVar42 + 5] = MVar44;
          MVar44 = MVar44 + '\x01';
          MVar43 = MVar43 + 0xfc;
          lVar26 = lVar42 + 4;
        } while ((int)(lVar42 + 4) != 0x7c);
        local_510.mcbot[lVar42 + 6] = 'j';
        local_510.mcbot[lVar42 + 7] = (MCode)(uVar30 >> 3);
        local_510.mcbot[lVar42 + 8] = 0xe9;
        *(int *)(local_510.mcbot + lVar42 + 9) = 0x12f39c - (int)local_510.mcbot;
        (local_510.J)->mcbot = local_510.mcbot + lVar42 + 0xd;
        local_510.mcbot = local_510.mcbot + lVar42 + 0xd;
        local_510.mclim = pMVar12 + lVar42 + 0x4d;
        (local_510.J)->exitstubgroup[uVar30] = pMVar12;
      }
      uVar30 = uVar30 + 1;
      MVar23 = MVar23 + ' ';
    } while (uVar30 != uVar5 + 0x1f >> 5);
  }
  local_510.mrm._4_2_ = local_510.mrm._4_2_ & 0xff00;
  local_140 = (global_State *)(J[-1].penalty + 0x23);
  local_158 = T;
  local_160 = J;
LAB_00136b7b:
  local_510.mcp = local_510.mctop;
  local_510.ir = J->curfinal->ir;
  (J->cur).nins = local_510.orignins;
  local_510.curins = local_510.orignins;
  pbVar33 = local_510.mctop;
  if (local_510.realign != (byte *)0x0) {
    if (((ulong)local_510.realign & 0xf) != 0) {
      pbVar33 = local_510.mctop + ~(ulong)(((uint)local_510.realign & 0xf) - 1);
      pcStack_530 = (code *)0x136bdf;
      memset(pbVar33,0x90,(ulong)((uint)local_510.realign & 0xf));
    }
    local_510.mctop = pbVar33;
    pbVar33 = pbVar33 + (ulong)(local_510.loopinv == 0) * 3;
  }
  if (local_510.loopref == 0) {
    local_510.mcp = pbVar33 + -0xc;
    local_510.invmcp = (byte *)0x0;
  }
  else {
    local_510.mcp = pbVar33 + -5;
    local_510.invmcp = pbVar33 + -5;
  }
  local_510.mcloop = (byte *)0x0;
  local_510.flagmcp = (byte *)0x0;
  local_510.topslot = 0;
  local_510.gcsteps = 0;
  local_510.sectref = local_510.loopref;
  local_510.fuseref = local_510.loopref;
  if ((local_510.flags >> 0x19 & 1) == 0) {
    local_510.fuseref = 0xffffffff;
  }
  uVar4 = (local_510.T)->sinktags;
  uVar36 = (undefined7)((ulong)unaff_RBP >> 8);
  unaff_RBP = (IRIns *)CONCAT71(uVar36,uVar4);
  local_510.curins = (local_510.T)->nins;
  uVar30 = (ulong)local_510.curins;
  local_510.freeset = 0xffffbfef;
  local_510.modset = 0;
  local_510.weakset = 0;
  local_510.phiset = 0;
  local_510.phireg[0x18] = 0;
  local_510.phireg[0x19] = 0;
  local_510.phireg[0x1a] = 0;
  local_510.phireg[0x1b] = 0;
  local_510.phireg[0x1c] = 0;
  local_510.phireg[0x1d] = 0;
  local_510.phireg[0x1e] = 0;
  local_510.phireg[0x1f] = 0;
  local_510.phireg[0x10] = 0;
  local_510.phireg[0x11] = 0;
  local_510.phireg[0x12] = 0;
  local_510.phireg[0x13] = 0;
  local_510.phireg[0x14] = 0;
  local_510.phireg[0x15] = 0;
  local_510.phireg[0x16] = 0;
  local_510.phireg[0x17] = 0;
  local_510.phireg[8] = 0;
  local_510.phireg[9] = 0;
  local_510.phireg[10] = 0;
  local_510.phireg[0xb] = 0;
  local_510.phireg[0xc] = 0;
  local_510.phireg[0xd] = 0;
  local_510.phireg[0xe] = 0;
  local_510.phireg[0xf] = 0;
  local_510.phireg[0] = 0;
  local_510.phireg[1] = 0;
  local_510.phireg[2] = 0;
  local_510.phireg[3] = 0;
  local_510.phireg[4] = 0;
  local_510.phireg[5] = 0;
  local_510.phireg[6] = 0;
  local_510.phireg[7] = 0;
  lVar26 = 0;
  do {
    local_510.cost[lVar26] = 0xffff0000;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x20);
  if ((ulong)(local_510.T)->nk < 0x8000) {
    lVar26 = (ulong)(local_510.T)->nk << 3;
    do {
      *(undefined2 *)((long)local_510.ir + lVar26 + 6) = 0xff;
      if (((0x605fd9U >> (*(uint *)((long)local_510.ir + lVar26 + 4) & 0x1f) & 1) != 0) &&
         (*(char *)((long)local_510.ir + lVar26 + 5) != '\x1b')) {
        *(undefined4 *)((long)local_510.ir + lVar26) = 0;
        lVar26 = lVar26 + 8;
      }
      bVar58 = lVar26 < 0x3fff8;
      lVar26 = lVar26 + 8;
    } while (bVar58);
  }
  *(undefined2 *)((long)local_510.ir + 0x40006) = 0x82;
  local_510.snaprename = local_510.curins;
  local_510.snapref = local_510.curins;
  local_510.snapno = (uint)(local_510.T)->nsnap;
  local_510.snapalloc = 0;
  local_510.stopins = 0x8000;
  local_510.orignins = local_510.curins;
  pIVar56 = local_510.ir + 0x8001;
  if (local_510.parent != (GCtrace *)0x0) {
    pcStack_530 = (code *)0x136d8e;
    pIVar21 = lj_snap_regspmap(local_510.J,local_510.parent,(local_510.J)->exitno,pIVar56);
    if (2000 < (long)pIVar21 - (long)pIVar56) {
LAB_0013be45:
      pcStack_530 = (code *)0x13be57;
      lj_trace_err(local_510.J,LJ_TRERR_NYICOAL);
    }
    local_510.stopins = (uint)((ulong)((long)pIVar21 + (-8 - (long)local_510.ir)) >> 3);
    if (pIVar56 < pIVar21) {
      puVar27 = local_510.parentmap;
      do {
        uVar5 = (pIVar56->field_0).prev;
        *puVar27 = uVar5;
        puVar27 = puVar27 + 1;
        IVar38 = uVar5 | 0x80;
        if (0xff < uVar5) {
          IVar38 = 0xff;
        }
        (pIVar56->field_0).prev = IVar38;
        pIVar56 = pIVar56 + 1;
      } while (pIVar56 < pIVar21);
    }
  }
  local_510.evenspill = 2;
  pIVar21 = local_510.ir + uVar30;
  if (pIVar56 < pIVar21) {
    bVar58 = false;
LAB_00136e23:
    if (uVar4 != '\0') {
      if ((pIVar56->field_1).r != 0xfe) {
        if ((pIVar56->field_1).r != 0xfd) goto LAB_00136e47;
        (pIVar56->field_1).r = 0xfe;
      }
      goto LAB_001370b4;
    }
LAB_00136e47:
    switch((pIVar56->field_1).o) {
    case '\x10':
      uVar54 = *(byte *)((long)pIVar56 + -3) - 0x5f;
      if ((4 < uVar54) || (uVar54 == 1)) goto switchD_00136e5e_caseD_42;
      *(undefined2 *)((long)pIVar56 + -2) = 0x80;
      (pIVar56->field_0).prev = 0x82;
      break;
    case '\x11':
switchD_00136e5e_caseD_11:
      bVar58 = true;
      goto switchD_00136e5e_caseD_42;
    default:
switchD_00136e5e_caseD_12:
      if ((((short)(pIVar56->field_0).op2 < 0) || (-1 < (short)(pIVar56->field_0).op1)) ||
         (IVar38 = *(IRRef1 *)((long)local_510.ir + (ulong)(pIVar56->field_0).op1 * 8 + 6),
         0xfc < (byte)IVar38)) goto switchD_00136e5e_caseD_42;
      (pIVar56->field_0).prev = IVar38;
      break;
    case '$':
    case '%':
    case '&':
      if ((local_510.flags & 0x40) == 0) goto switchD_00136e5e_caseD_27;
      goto switchD_00136e5e_caseD_42;
    case '\'':
    case '(':
switchD_00136e5e_caseD_27:
      uVar5 = (pIVar56->field_0).op2;
      if (((short)uVar5 < 0) && (0xfc < *(byte *)((long)local_510.ir + (ulong)uVar5 * 8 + 6))) {
        *(undefined1 *)((long)local_510.ir + (ulong)uVar5 * 8 + 6) = 0x81;
        if (!bVar58) goto LAB_001370ab;
        local_510._168_8_ = local_510._168_8_ | 0x200000000;
        goto switchD_00136e5e_caseD_11;
      }
      goto switchD_00136e5e_caseD_42;
    case ',':
    case '-':
switchD_00136e5e_caseD_2c:
      if (((pIVar56->field_1).t.irt & 0x1f) == 0xe) goto switchD_00136e5e_caseD_42;
      (pIVar56->field_0).prev = 0x80;
      if (!bVar58) goto LAB_0013708e;
      local_510._168_8_ = local_510._168_8_ | 0xfc700000000;
LAB_00136e7a:
      bVar58 = true;
      break;
    case '.':
      if (((pIVar56->field_1).t.irt & 0x1f) != 0xe) goto switchD_00136e5e_caseD_2c;
LAB_00137093:
      if (bVar58) {
        local_510._168_8_ = local_510._168_8_ | 0xffff0fc700000000;
      }
      (pIVar56->field_0).prev = 0x90;
      break;
    case '4':
      if (2 < (pIVar56->field_0).op2) goto LAB_00137093;
      if ((local_510.flags & 0x20) == 0) {
        (pIVar56->field_0).prev = 0x90;
        if (!bVar58) goto LAB_0013708e;
        local_510._168_8_ = local_510._168_8_ | 0xf000100000000;
        goto LAB_00136e7a;
      }
      goto switchD_00136e5e_caseD_42;
    case ';':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'V':
    case 'W':
    case ']':
      (pIVar56->field_0).prev = 0x80;
      if (bVar58) {
        local_510.modset = 0xffff0fc7;
        goto LAB_00136e7a;
      }
LAB_0013708e:
      bVar58 = false;
      break;
    case 'B':
    case 'C':
    case 'D':
    case 'F':
    case 'H':
    case '\\':
      goto switchD_00136e5e_caseD_42;
    case 'Y':
    case '^':
      if (bVar58) {
        local_510.modset = 0xffff0fc7;
        goto switchD_00136e5e_caseD_11;
      }
LAB_001370ab:
      bVar58 = false;
      goto switchD_00136e5e_caseD_42;
    case '[':
      if ((1 < (byte)(((pIVar56->field_1).t.irt & 0x1f) - 0xd)) &&
         (1 < (ushort)(((pIVar56->field_0).op2 & 0x1f) - 0xd))) goto switchD_00136e5e_caseD_12;
switchD_00136e5e_caseD_42:
      (pIVar56->field_0).prev = 0xff;
      break;
    case '_':
    case '`':
    case 'b':
      goto switchD_00136e5e_caseD_5f;
    case 'a':
      if (((pIVar56->field_0).op2 == 0x25) && (local_510.evenspill < 4)) {
        local_510.evenspill = 4;
      }
      goto switchD_00136e5e_caseD_5f;
    case 'c':
      pcStack_530 = (code *)0x13702b;
      local_130 = asm_callx_flags(&local_510,pIVar56);
      pcStack_530 = (code *)0x137045;
      RVar15 = asm_setup_call_slots(&local_510,pIVar56,(CCallInfo *)&local_138.gcr);
      (pIVar56->field_0).prev = (IRRef1)RVar15;
      if (bVar58) {
        local_510._168_8_ = local_510._168_8_ | 0xffff0fc700000000;
      }
    }
    goto LAB_001370b4;
  }
LAB_001370c1:
  local_510.oddspill = local_510.evenspill;
  if ((local_510.evenspill & 1U) == 0) {
    local_510.oddspill = 0;
  }
  else {
    local_510.evenspill = local_510.evenspill + 1;
  }
  if (local_510.loopref != 0) goto switchD_0013780f_caseD_c;
  uVar48 = (ulong)((local_510.T)->nsnap - 1);
  pSVar8 = (local_510.T)->snap;
  uVar30 = (ulong)pSVar8[uVar48].nent;
  if (uVar30 == 0) {
    unaff_RBP = (IRIns *)0x0;
    uVar54 = 0;
  }
  else {
    uVar11 = 0;
    do {
      uVar54 = ((local_510.T)->snapmap[(ulong)pSVar8[uVar48].mapofs + (uVar30 - 1)] >> 0x18) - 1;
      if (((local_510.T)->snapmap[(ulong)pSVar8[uVar48].mapofs + (uVar30 - 1)] >> 0x10 & 1) != 0) {
        uVar11 = 1;
        goto LAB_00137159;
      }
      uVar30 = uVar30 - 1;
    } while (uVar30 != 0);
    uVar54 = 0;
LAB_00137159:
    unaff_RBP = (IRIns *)CONCAT71(uVar36,uVar11);
  }
  pSVar8 = pSVar8 + uVar48;
  local_510.topslot = (uint)pSVar8->topslot;
  if (local_510.mclim <= local_510.mcp) {
    pcStack_530 = (code *)0x1371a0;
    ra_allocref(&local_510,0x8000,4);
    if ((local_510.T)->link == 0) {
      u64_00 = (uint *)(*(ulong *)((local_510.T)->snapmap + ((uint)pSVar8->nent + pSVar8->mapofs))
                       >> 8);
      if (((char)*u64_00 == 'W') &&
         (uVar9 = (local_510.J)->trace[*u64_00 >> 0x10].gcptr64,
         0xfffffffb < *(byte *)(uVar9 + 0x50) - 0x4d)) {
        u64_00 = (uint *)(uVar9 + 0x50);
      }
      pcStack_530 = (code *)0x137237;
      emit_loadu64(&local_510,3,(uint64_t)u64_00);
      iVar55 = ~uVar54 + (uint)pSVar8->nslots;
      uVar24 = *u64_00;
      uVar47 = (uVar24 & 0xff) - 0x3f;
      uVar47 = uVar47 >> 1 | (uint)((uVar47 & 1) != 0) << 0x1f;
      if (uVar47 - 1 < 2) {
        iVar55 = (iVar55 - ((uVar24 >> 0x10 & 0xff) + (uVar24 >> 8 & 0xff))) + -2;
      }
      else {
        if (uVar47 == 0) {
          uVar24 = uVar24 >> 8 & 0xff;
        }
        else {
          if (uVar47 != 5) {
            if ((uVar24 & 0xff) < 0x59) {
              iVar55 = 0;
            }
            goto LAB_00137294;
          }
          uVar24 = (uVar24 >> 0x10) + (uVar24 >> 8 & 0xff);
        }
        iVar55 = iVar55 - uVar24;
      }
LAB_00137294:
      if ((iVar55 == 0) && ((*local_510.mcp == 0xf || ((*local_510.mcp & 0xf0) != 0x70)))) {
        (local_510.mcp + -2)[0] = 0x33;
        (local_510.mcp + -2)[1] = 0xc0;
        local_510.mcp = local_510.mcp + -2;
      }
      else {
        *(int *)(local_510.mcp + -4) = iVar55;
        local_510.mcp[-5] = 0xb8;
        local_510.mcp = local_510.mcp + -5;
      }
    }
    else if (uVar54 != 0) {
      pcStack_530 = (code *)0x1371de;
      emit_rma(&local_510,XO_MOVto,0x80202,&local_510.J[-1].penalty[0x3a].val);
    }
    local_520 = (uint)unaff_RBP;
    if (uVar54 != 0) {
      iVar55 = uVar54 * 8;
      if ((char)(byte)iVar55 == iVar55) {
        local_510.mcp[-1] = (byte)iVar55;
        local_510.mcp = local_510.mcp + -1;
        uVar52 = 0x830000fe;
      }
      else {
        *(int *)(local_510.mcp + -4) = iVar55;
        local_510.mcp = local_510.mcp + -4;
        uVar52 = 0x810000fe;
      }
      local_510.mcp[-1] = 0xc2;
      *(undefined4 *)(local_510.mcp + -5) = uVar52;
      local_510.mcp[-3] = 0x48;
      local_510.mcp = local_510.mcp + -3;
    }
    if ((ulong)(local_510.J)->ktrace != 0) {
      local_510.ir[(ulong)(local_510.J)->ktrace + 1] = (IRIns)(local_510.J)->curfinal;
      *(undefined1 *)((long)local_510.ir + (ulong)(local_510.J)->ktrace * 8 + 5) = 0x18;
    }
    IVar31.gcr.gcptr64._1_7_ = 0;
    IVar31.field_0.op1._0_1_ = pSVar8->nent;
    local_518 = uVar48;
    if (IVar31 != (IRIns)0x0) {
      uVar54 = pSVar8->mapofs;
      pSVar10 = (local_510.T)->snapmap;
      IVar53 = (IRIns)0x0;
      local_528 = IVar31;
      do {
        uVar24 = pSVar10[(ulong)uVar54 + (long)IVar53];
        unaff_RBP = (IRIns *)(ulong)uVar24;
        if ((uVar24 >> 0x12 & 1) == 0) {
          iVar55 = (uVar24 >> 0x18) * 8 + -0x10;
          uVar45 = (uVar24 >> 0x18) * 8;
          pIVar56 = (IRIns *)((ulong)((uVar24 & 0xffff) * 8) + (long)local_510.ir);
          uVar47 = uVar24 & 0xffff;
          if ((uVar24 >> 0x14 & 1) == 0) {
            if (((pIVar56->field_1).t.irt & 0x1f) == 0xe) {
              RVar15 = (Reg)(pIVar56->field_1).r;
              if ((char)(pIVar56->field_1).r < '\0') {
                pcStack_530 = (code *)0x1373d2;
                RVar15 = ra_allocref(&local_510,uVar24 & 0xffff,0xffff0000);
              }
              bVar50 = (byte)RVar15 & 0x1f;
              local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              xVar35 = XO_MOVSDto;
            }
            else {
              if (uVar47 < 0x8000) {
                pcStack_530 = (code *)0x137457;
                lj_ir_kvalue((local_510.J)->L,&local_138,pIVar56);
                IVar31 = local_528;
                if (local_138.u64 != 0xffffffffffffffff) {
                  *(uint32_t *)(local_510.mcp + -4) = local_138.field_4.it;
                  if (uVar45 < 0x8c) {
                    local_510.mcp[-5] = (byte)(uVar45 - 0xc);
                    pbVar33 = local_510.mcp + -5;
                    bVar50 = 0x42;
                  }
                  else {
                    *(uint *)(local_510.mcp + -8) = uVar45 - 0xc;
                    pbVar33 = local_510.mcp + -8;
                    bVar50 = 0x82;
                  }
                  pbVar33[-1] = bVar50;
                  pbVar33[-2] = 199;
                  uVar52 = local_138.field_4.i;
                  goto LAB_00137647;
                }
                pbVar33 = local_510.mcp + -4;
                pbVar32 = local_510.mcp + -4;
                pbVar32[0] = 0xff;
                pbVar32[1] = 0xff;
                pbVar32[2] = 0xff;
                pbVar32[3] = 0xff;
                if (iVar55 == 0) {
                  bVar50 = 2;
                }
                else if (uVar24 < 0x12000000) {
                  local_510.mcp[-5] = (byte)iVar55;
                  pbVar33 = local_510.mcp + -5;
                  bVar50 = 0x42;
                }
                else {
                  *(int *)(local_510.mcp + -8) = iVar55;
                  pbVar33 = local_510.mcp + -8;
                  bVar50 = 0x82;
                }
                pbVar33[-1] = bVar50;
                pbVar33[-3] = 0x48;
                pbVar33[-2] = 199;
                local_510.mcp = pbVar33 + -3;
                goto LAB_00137688;
              }
              RVar15 = (Reg)(pIVar56->field_1).r;
              if ((char)(pIVar56->field_1).r < '\0') {
                pcStack_530 = (code *)0x13753a;
                RVar15 = ra_allocref(&local_510,uVar47,0xbfeb);
              }
              bVar50 = (byte)RVar15 & 0x1f;
              local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              uVar24 = (pIVar56->field_1).t.irt & 0x1f;
              uVar47 = ~uVar24;
              if ((0x605fd9U >> uVar24 & 1) == 0) {
                *(uint *)(local_510.mcp + -4) = uVar47 << 0xf | 0x7fff;
                if (uVar45 < 0x8c) {
                  local_510.mcp[-5] = (byte)(uVar45 - 0xc);
                  local_510.mcp = local_510.mcp + -5;
                  bVar50 = 199;
                  bVar14 = 0x42;
                }
                else {
                  *(uint *)(local_510.mcp + -8) = uVar45 - 0xc;
                  local_510.mcp = local_510.mcp + -8;
                  bVar50 = 199;
                  bVar14 = 0x82;
                }
              }
              else {
                *(uint *)(local_510.mcp + -4) = uVar47 << 0xf;
                if (uVar45 < 0x8c) {
                  local_510.mcp[-5] = (byte)(uVar45 - 0xc);
                  local_510.mcp = local_510.mcp + -5;
                  bVar50 = 0x81;
                  bVar14 = 0x4a;
                }
                else {
                  *(uint *)(local_510.mcp + -8) = uVar45 - 0xc;
                  local_510.mcp = local_510.mcp + -8;
                  bVar50 = 0x81;
                  bVar14 = 0x8a;
                }
              }
              local_510.mcp[-1] = bVar14;
              local_510.mcp[-2] = bVar50;
              local_510.mcp = local_510.mcp + -2;
              uVar24._0_2_ = *(IROpT *)((long)pIVar56 + 4);
              uVar24._2_2_ = *(IRRef1 *)((long)pIVar56 + 6);
              RVar15 = -(uint)((0x605fd9U >> (uVar24 & 0x1f) & 1) != 0) & 0x80200 | RVar15;
              xVar35 = XO_MOVto;
            }
LAB_0013750c:
            pcStack_530 = (code *)0x137519;
            emit_rmro(&local_510,xVar35,RVar15,2,iVar55);
            IVar31 = local_528;
          }
          else {
            pbVar33 = local_510.mcp + -4;
            pbVar33[0] = 0xff;
            pbVar33[1] = 0x7f;
            pbVar33[2] = 0xfe;
            pbVar33[3] = 0xff;
            if (uVar45 < 0x8c) {
              local_510.mcp[-5] = (byte)(uVar45 - 0xc);
              pbVar33 = local_510.mcp + -5;
              bVar50 = 0x42;
            }
            else {
              *(uint *)(local_510.mcp + -8) = uVar45 - 0xc;
              pbVar33 = local_510.mcp + -8;
              bVar50 = 0x82;
            }
            pbVar33[-1] = bVar50;
            local_510.mcp = pbVar33 + -2;
            pbVar33[-2] = 199;
            if (0x7fff < uVar47) {
              bVar50 = *(byte *)((long)local_510.ir + (ulong)(ushort)uVar24 * 8 + 6);
              RVar15 = (Reg)bVar50;
              if ((char)bVar50 < '\0') {
                pcStack_530 = (code *)0x1374f0;
                RVar15 = ra_allocref(&local_510,uVar47,0xbfeb);
              }
              bVar50 = (byte)RVar15 & 0x1f;
              local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              xVar35 = XO_MOVto;
              goto LAB_0013750c;
            }
            uVar52 = (pIVar56->field_1).op12;
LAB_00137647:
            local_510.mcp = pbVar33 + -6;
            *(undefined4 *)(pbVar33 + -6) = uVar52;
            if (iVar55 == 0) {
              bVar50 = 2;
            }
            else if (uVar24 < 0x12000000) {
              pbVar33[-7] = (byte)iVar55;
              local_510.mcp = pbVar33 + -7;
              bVar50 = 0x42;
            }
            else {
              *(int *)(pbVar33 + -10) = iVar55;
              local_510.mcp = pbVar33 + -10;
              bVar50 = 0x82;
            }
            local_510.mcp[-1] = bVar50;
            local_510.mcp[-2] = 199;
            local_510.mcp = local_510.mcp + -2;
LAB_00137688:
          }
          if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
        }
        IVar53.field_0 = IVar53.field_0 + 1;
      } while (IVar31 != IVar53);
    }
    if ((local_510.parent == (GCtrace *)0x0 & (byte)local_520) == 1) {
      pcStack_530 = (code *)0x13776b;
      asm_stack_check(&local_510,local_510.topslot,(IRIns *)0x0,local_510.freeset & 0xbfef,
                      (ExitNo)local_518);
    }
switchD_0013780f_caseD_c:
    do {
      local_510.curins = local_510.curins - 1;
      if (local_510.curins <= local_510.stopins) goto LAB_0013b192;
      unaff_RBP = local_510.ir + local_510.curins;
      pcStack_530 = (code *)0x1377a0;
      asm_snap_prev(&local_510);
      if ((((-1 < (char)(unaff_RBP->field_1).r) || ((unaff_RBP->field_1).s != '\0')) ||
          (0x5f < (((unaff_RBP->field_1).t.irt | 0x60) & lj_ir_mode[(unaff_RBP->field_1).o]))) ||
         ((local_510.flags & 0x40000) == 0)) {
        if ((char)(unaff_RBP->field_1).t.irt < '\0') {
          pcStack_530 = (code *)0x1377dd;
          asm_snap_prep(&local_510);
        }
        TVar13 = local_138;
        pIVar56 = local_510.ir;
        if (local_510.mcp < local_510.mclim) break;
        switch((unaff_RBP->field_1).o) {
        case '\0':
        case '\x01':
        case '\x02':
        case '\x03':
        case '\x04':
        case '\x05':
        case '\x06':
        case '\a':
        case '\n':
          goto switchD_0013780f_caseD_0;
        case '\b':
        case '\t':
          if ((*(char *)((long)unaff_RBP + -3) == ':') &&
             (local_510.curins - 1 == (uint)(unaff_RBP->field_0).op1)) {
            pIVar1 = &(unaff_RBP->field_1).o;
            unaff_RBP = unaff_RBP + -1;
            pcStack_530 = (code *)0x137a78;
            local_510.curins = local_510.curins - 1;
            asm_href(&local_510,unaff_RBP,(uint)*pIVar1);
          }
          else {
switchD_0013780f_caseD_0:
            pcStack_530 = (code *)0x13781e;
            asm_comp(&local_510,unaff_RBP);
          }
          goto switchD_0013780f_caseD_c;
        case '\v':
          RVar15 = (Reg)*(byte *)((long)local_510.ir + 0x40006);
          if ((char)*(byte *)((long)local_510.ir + 0x40006) < '\0') {
            pcStack_530 = (code *)0x1383bf;
            RVar15 = ra_allocref(&local_510,0x8000,0xbfef);
          }
          bVar50 = (byte)RVar15 & 0x1f;
          local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
          pcStack_530 = (code *)0x1383e9;
          RVar17 = ra_scratch(&local_510,~(1 << (RVar15 & 0x1f)) & 0xbfef);
          local_528 = local_510.ir[(ulong)(unaff_RBP->field_0).op2 + 1];
          bVar50 = *(byte *)((long)local_528 + -3);
          BVar39 = local_510.topslot - (bVar50 + 2);
          BVar29 = 0;
          if (0 < (int)BVar39) {
            BVar29 = BVar39;
          }
          local_510.topslot = BVar29;
          *(byte *)((long)local_510.ir + 0x40004U) = *(byte *)((long)local_510.ir + 0x40004U) | 0x20
          ;
          unaff_RBP = (IRIns *)(ulong)RVar17;
          pcStack_530 = (code *)0x13844f;
          emit_rma(&local_510,XO_MOVto,RVar15 | 0x80200,&local_510.J[-1].penalty[0x3a].val);
          pcStack_530 = (code *)0x138468;
          emit_gri(&local_510,0x838100,RVar15 | 0x80200,-((uint)bVar50 * 8 + 0x10));
          pcStack_530 = (code *)0x138475;
          asm_guardcc(&local_510,5);
          pcStack_530 = (code *)0x138491;
          emit_rmro(&local_510,XO_CMP,RVar17 | 0x80200,RVar15,-8);
          pcStack_530 = (code *)0x13849f;
          emit_loadu64(&local_510,RVar17,(uint64_t)local_528);
        case '\f':
        case 'Z':
        case 'd':
          goto switchD_0013780f_caseD_c;
        default:
          ((local_510.J)->errinfo).n = (double)(unaff_RBP->field_1).o;
          pcStack_530 = (code *)0x13be8a;
          lj_trace_err_info(local_510.J,LJ_TRERR_NYIIR);
        case '\x0f':
          iVar55 = local_510.gcsteps;
          for (pIVar56 = local_510.ir + (local_510.stopins + 1); pIVar56 < unaff_RBP;
              pIVar56 = pIVar56 + 1) {
            if (((byte)((pIVar56->field_1).o + 0xaf) < 4) &&
               ((-1 < (char)(pIVar56->field_1).r || ((pIVar56->field_1).s != '\0')))) {
              iVar55 = iVar55 + 1;
              local_510.gcsteps = iVar55;
            }
          }
          if (local_510.gcsteps != 0) {
            pcStack_530 = (code *)0x138502;
            asm_gc_check(&local_510);
          }
          local_510.gcsteps = -0x80000000;
          goto switchD_0013780f_caseD_c;
        case '\x10':
          bVar58 = true;
          bVar57 = true;
          if (*(char *)((long)unaff_RBP + -2) < '\0') {
            bVar57 = *(char *)((long)unaff_RBP + -1) != '\0';
          }
          if ((char)(unaff_RBP->field_1).r < '\0') {
            bVar58 = (unaff_RBP->field_1).s != '\0';
          }
          if ((local_510.flags & 0x40000) == 0) {
            bVar57 = true;
            bVar58 = true;
          }
          if ((((bVar58) && (uVar54 = *(byte *)((long)unaff_RBP + -3) - 0x5f, uVar54 < 5)) &&
              (uVar54 != 1)) && (!bVar57)) {
            pcStack_530 = (code *)0x138290;
            ra_allocref(&local_510,(uint)(unaff_RBP->field_0).op1,1);
          }
          goto switchD_0013780f_caseD_c;
        case '\x11':
          local_510.loopsnapno = local_510.snapno;
          if (local_510.gcsteps != 0) {
            pcStack_530 = (code *)0x13876e;
            asm_gc_check(&local_510);
          }
          local_510.sectref = 0;
          local_510.invmcp = (byte *)0x0;
          local_510.flagmcp = (byte *)0x0;
          if (local_510.fuseref != 0xffffffff) {
            local_510.fuseref = 0;
          }
          while( true ) {
            if (local_510.phiset == 0) {
              RVar51 = 0;
              blocked = 0;
            }
            else {
              blocked = 0;
              RVar51 = 0;
              RVar46 = local_510.phiset;
              do {
                uVar54 = 0;
                if (RVar46 != 0) {
                  for (; (RVar46 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                  }
                }
                bVar50 = *(byte *)((long)local_510.ir + (ulong)local_510.phireg[uVar54] * 8 + 6);
                uVar24 = (uint)bVar50;
                if (uVar54 != bVar50) {
                  if ((local_510.freeset >> (uVar54 & 0x1f) & 1) == 0) {
                    uVar5 = (ushort)local_510.cost[uVar54];
                    if ((*(byte *)((long)local_510.ir + (ulong)uVar5 * 8 + 4) & 0x20) == 0) {
                      pcStack_530 = (code *)0x138807;
                      ra_restore(&local_510,(uint)uVar5);
                      if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
                    }
                    else {
                      blocked = blocked | 1 << ((byte)uVar54 & 0x1f);
                      uVar24 = 0;
                      if (-1 < (char)bVar50) {
                        uVar24 = 1 << (bVar50 & 0x1f);
                      }
                      RVar51 = RVar51 | uVar24;
                      uVar24 = 0x80;
                    }
                  }
                  if (uVar24 < 0x80) {
                    pcStack_530 = (code *)0x138851;
                    ra_rename(&local_510,uVar24,uVar54);
                    if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
                  }
                }
                bVar50 = (byte)uVar54 & 0x1f;
                RVar46 = RVar46 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              } while (RVar46 != 0);
            }
            if (blocked == 0) break;
            if ((local_510.freeset & blocked) == 0) {
              pcStack_530 = (code *)0x1388a9;
              asm_phi_break(&local_510,blocked,RVar51,0xbfef);
              pcStack_530 = (code *)0x1388ba;
              asm_phi_break(&local_510,blocked,RVar51,0xffff0000);
              if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
            }
          }
          uVar54 = ~(local_510.phiset | local_510.freeset) & local_510.modset & 0xffff0000;
          while (uVar54 != 0) {
            uVar24 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
              }
            }
            pcStack_530 = (code *)0x138fbd;
            ra_restore(&local_510,(uint)(ushort)local_510.cost[uVar24]);
            uVar54 = uVar54 & ~(1 << (uVar24 & 0x1f));
            if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
          }
          uVar54 = ~(local_510.phiset | local_510.freeset) & local_510.modset;
          while (uVar54 != 0) {
            uVar24 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
              }
            }
            pcStack_530 = (code *)0x139008;
            ra_restore(&local_510,(uint)(ushort)local_510.cost[uVar24]);
            uVar54 = uVar54 & ~(1 << (uVar24 & 0x1f));
            if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
          }
          pbVar33 = local_510.mcp;
          for (uVar54 = local_510.phiset; local_510.mcp = pbVar33, uVar54 != 0;
              uVar54 = uVar54 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50)) {
            uVar47 = uVar54 >> 0x18 | (uVar54 & 0xff0000) >> 8 | (uVar54 & 0xff00) << 8 |
                     uVar54 << 0x18;
            uVar24 = 0x1f;
            if (uVar47 != 0) {
              for (; uVar47 >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            uVar24 = uVar24 ^ 0x18;
            uVar5 = local_510.phireg[uVar24];
            uVar30 = (ulong)uVar5;
            if (*(char *)((long)local_510.ir + uVar30 * 8 + 7) != '\0') {
              pIVar56 = local_510.ir + uVar30;
              (pIVar56->field_1).t.irt = (pIVar56->field_1).t.irt & 0xdf;
              bVar50 = *(byte *)((long)local_510.ir + uVar30 * 8 + 6);
              if ((char)bVar50 < '\0') {
                pcStack_530 = (code *)0x13907e;
                RVar15 = ra_allocref(&local_510,(uint)uVar5,1 << ((byte)uVar24 & 0x1f));
                bVar50 = (byte)RVar15;
              }
              local_510.weakset =
                   local_510.weakset &
                   (-2 << (bVar50 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar50 & 0x1f));
              pcStack_530 = (code *)0x1390ae;
              emit_storeofs(&local_510,pIVar56,uVar24,4,(uint)(pIVar56->field_1).s << 2);
              if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
            }
            bVar50 = (byte)uVar24 & 0x1f;
            pbVar33 = local_510.mcp;
          }
          unaff_RBP = (IRIns *)0x0;
          if (*(char *)((long)local_510.ir + (ulong)(local_510.orignins - 1) * 8 + 5) == '\x13') {
            pIVar56 = local_510.ir + (local_510.orignins - 1);
            unaff_RBP = (IRIns *)0x0;
            do {
              if (((pIVar56->field_1).s != '\0') &&
                 (*(char *)((long)local_510.ir + (ulong)(pIVar56->field_0).op1 * 8 + 7) != '\0')) {
                unaff_RBP = (IRIns *)(ulong)((uint)unaff_RBP |
                                            ((byte)(((pIVar56->field_1).t.irt & 0x1f) - 0xd) < 2) +
                                            1);
              }
              pcVar2 = (char *)((long)pIVar56 + -3);
              pIVar56 = pIVar56 + -1;
            } while (*pcVar2 == '\x13');
          }
          if (((ulong)unaff_RBP & 1) != 0) {
            if ((local_510._168_8_ & 0xbfef) == 0) {
              uVar30 = 0;
              uVar54 = -(uint)((0x605fd9U >>
                                (*(uint *)((long)local_510.ir +
                                          (ulong)(ushort)local_510.cost[0] * 8 + 4) & 0x1f) & 1) !=
                              0) & 0x80200;
              pbVar33[-1] = 0x24;
              pbVar33[-3] = 0x8b;
              pbVar33[-2] = 4;
              if ((short)uVar54 == 0) {
                local_510.mcp = pbVar33 + -3;
              }
              else {
                local_510.mcp = pbVar33 + -4;
                pbVar33[-4] = (byte)(uVar54 >> 0x10) | 0x40;
              }
            }
            else {
              uVar54 = 0;
              if ((local_510._168_8_ & 0xbfef) != 0) {
                for (; ((local_510.freeset & 0xbfef) >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                }
              }
              uVar30 = (ulong)uVar54;
            }
            uVar54 = (uint)uVar30;
            if (*(char *)((long)local_510.ir + (ulong)(local_510.orignins - 1) * 8 + 5) == '\x13') {
              pIVar56 = local_510.ir + (local_510.orignins - 1);
              do {
                if ((pIVar56->field_1).s != '\0') {
                  bVar50 = *(byte *)((long)local_510.ir + (ulong)(pIVar56->field_0).op1 * 8 + 7);
                  if ((bVar50 != 0) && (1 < (byte)(((pIVar56->field_1).t.irt & 0x1f) - 0xd))) {
                    pcStack_530 = (code *)0x13a885;
                    emit_storeofs(&local_510,local_510.ir + (pIVar56->field_0).op1,uVar54,4,
                                  (uint)bVar50 << 2);
                    pcStack_530 = (code *)0x13a8a0;
                    emit_loadofs(&local_510,pIVar56,uVar54,4,(uint)(pIVar56->field_1).s << 2);
                    if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
                  }
                }
                pcVar2 = (char *)((long)pIVar56 + -3);
                pIVar56 = pIVar56 + -1;
              } while (*pcVar2 == '\x13');
            }
            if ((local_510.freeset >> (uVar54 & 0x1f) & 1) == 0) {
              pcStack_530 = (code *)0x13a8f4;
              emit_storeofs(&local_510,local_510.ir + (ushort)local_510.cost[uVar30],uVar54,4,0);
            }
          }
          if (((ulong)unaff_RBP & 2) != 0) {
            uVar54 = 0;
            bVar58 = (local_510._168_8_ & 0xffff0000) != 0;
            if (bVar58) {
              for (; ((local_510.freeset & 0xffff0000) >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
              }
            }
            uVar30 = 0x10;
            if (bVar58) {
              uVar30 = (ulong)uVar54;
            }
            uVar54 = (uint)uVar30;
            uVar24 = 1 << ((byte)uVar30 & 0x1f);
            unaff_RBP = (IRIns *)(ulong)uVar24;
            if ((local_510.freeset >> (uVar54 & 0x1f) & 1) == 0) {
              pcStack_530 = (code *)0x13a94b;
              emit_loadofs(&local_510,local_510.ir + (ushort)local_510.cost[uVar30],uVar54,4,0);
            }
            if (*(char *)((long)local_510.ir + (ulong)(local_510.orignins - 1) * 8 + 5) == '\x13') {
              pIVar56 = local_510.ir + (local_510.orignins - 1);
              do {
                if ((pIVar56->field_1).s != '\0') {
                  bVar50 = *(byte *)((long)local_510.ir + (ulong)(pIVar56->field_0).op1 * 8 + 7);
                  if ((bVar50 != 0) && ((byte)(((pIVar56->field_1).t.irt & 0x1f) - 0xd) < 2)) {
                    pcStack_530 = (code *)0x13a9b4;
                    emit_storeofs(&local_510,local_510.ir + (pIVar56->field_0).op1,uVar54,4,
                                  (uint)bVar50 << 2);
                    pcStack_530 = (code *)0x13a9cf;
                    emit_loadofs(&local_510,pIVar56,uVar54,4,(uint)(pIVar56->field_1).s << 2);
                    if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
                  }
                }
                pcVar2 = (char *)((long)pIVar56 + -3);
                pIVar56 = pIVar56 + -1;
              } while (*pcVar2 == '\x13');
            }
            if ((local_510.freeset & uVar24) == 0) {
              pcStack_530 = (code *)0x13aa20;
              emit_storeofs(&local_510,local_510.ir + (ushort)local_510.cost[uVar30],uVar54,4,0);
            }
          }
          iVar55 = (int)local_510.mcp;
          if (local_510.realign == (byte *)0x0) {
            local_510.mctop[-5] = 0xe9;
            if (local_510.loopinv == 0) {
              iVar40 = iVar55 - (int)local_510.mctop;
              lVar26 = 3;
              lVar42 = -4;
              pbVar32 = local_510.mctop;
LAB_0013aac8:
              *(int *)(local_510.mctop + lVar42) = iVar40;
              pbVar22 = local_510.mcp + lVar26;
            }
            else {
              pbVar32 = local_510.mctop + -5;
              iVar40 = iVar55 - (int)pbVar32;
              *(int *)(local_510.mctop + -9) = iVar40;
              if (local_510.loopinv == 2) {
                iVar40 = iVar40 + 6;
                lVar26 = 8;
                lVar42 = -0xf;
                goto LAB_0013aac8;
              }
              pbVar22 = local_510.mcp + 4;
            }
            if (pbVar32 + -0x80 <= pbVar22) {
              local_510.realign = pbVar22;
              local_510.curins = local_510.stopins;
              (local_510.T)->nins = local_510.orignins;
            }
          }
          else {
            local_510.realign = (byte *)0x0;
            if (local_510.loopinv == 0) {
              local_510.mctop[-1] = (char)local_510.mcp - (char)local_510.mctop;
              local_510.mctop[-2] = 0xeb;
            }
            else {
              local_510.mctop[-5] = 0xe9;
              bVar50 = (char)local_510.mcp - ((char)local_510.mctop + -5);
              local_510.mctop[-6] = bVar50;
              if (local_510.loopinv == 2) {
                local_510.mctop[-8] = bVar50 + 2;
              }
            }
          }
          local_510.mcloop = local_510.mcp;
          if (local_510.mcp != pbVar33) {
            *(int *)(local_510.mcp + -4) = (int)pbVar33 - iVar55;
            local_510.mcp[-5] = 0xe9;
            local_510.mcp = local_510.mcp + -5;
            goto LAB_0013ab2e;
          }
          goto switchD_0013780f_caseD_c;
        case '\x12':
          bVar50 = *(byte *)((long)local_510.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
          if ((char)bVar50 < '\0') {
            RVar51 = 0xbfef;
            if ((byte)(((unaff_RBP->field_1).t.irt & 0x1f) - 0xd) < 2) {
              RVar51 = 0xffff0000;
            }
            pcStack_530 = (code *)0x138337;
            RVar15 = ra_allocref(&local_510,(uint)(unaff_RBP->field_0).op1,RVar51);
            bVar50 = (byte)RVar15;
          }
          local_510.weakset =
               local_510.weakset & (-2 << (bVar50 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar50 & 0x1f));
          goto switchD_0013780f_caseD_c;
        case '\x13':
          uVar54 = 0xbfef;
          if ((byte)(((unaff_RBP->field_1).t.irt & 0x1f) - 0xd) < 2) {
            uVar54 = 0xffff0000;
          }
          if ((unaff_RBP->field_1).r != 0xfe) {
            uVar30 = (ulong)(unaff_RBP->field_0).op1;
            if (*(char *)((long)local_510.ir + uVar30 * 8 + 7) == '\0') {
              pIVar21 = local_510.ir + (unaff_RBP->field_0).op2;
              if ((pIVar21->field_1).s == '\0') {
                uVar54 = uVar54 & ~local_510.phiset;
                if ((local_510.freeset & uVar54 & (local_510.freeset & uVar54) - 1) != 0) {
                  if ((char)(pIVar21->field_1).r < '\0') {
                    pcStack_530 = (code *)0x13a688;
                    RVar15 = ra_allocref(&local_510,(uint)(unaff_RBP->field_0).op2,uVar54);
                  }
                  else {
                    pcStack_530 = (code *)0x139ff7;
                    RVar15 = ra_scratch(&local_510,uVar54);
                    pcStack_530 = (code *)0x13a00b;
                    emit_movrr(&local_510,pIVar21,RVar15,(uint)(pIVar21->field_1).r);
                  }
                  bVar50 = (byte)RVar15;
                  (unaff_RBP->field_1).r = bVar50;
                  local_510.phiset = local_510.phiset | 1 << (bVar50 & 0x1f);
                  local_510.phireg[RVar15] = (unaff_RBP->field_0).op1;
                  pbVar33 = (byte *)((long)pIVar56 + uVar30 * 8 + 4);
                  *pbVar33 = *pbVar33 | 0x20;
                  if (*(char *)((long)pIVar56 + uVar30 * 8 + 6) < '\0') {
                    *(byte *)((long)pIVar56 + uVar30 * 8 + 6) = bVar50 | 0x80;
                  }
                  goto switchD_0013780f_caseD_c;
                }
                if ((*(char *)((long)local_510.ir + uVar30 * 8 + 6) < '\0') &&
                   ((char)(pIVar21->field_1).r < '\0')) {
                  pcStack_530 = (code *)0x138698;
                  ra_spill(&local_510,unaff_RBP);
                  (pIVar21->field_1).s = (unaff_RBP->field_1).s;
                  goto switchD_0013780f_caseD_c;
                }
              }
            }
            pcStack_530 = (code *)0x13be69;
            lj_trace_err(local_510.J,LJ_TRERR_NYIPHI);
          }
          goto switchD_0013780f_caseD_c;
        case '\x15':
          pcStack_530 = (code *)0x138a2f;
          asm_guardcc(&local_510,5);
          local_510.mcp[-1] = 0x80;
          addr = (void *)((long)&local_510.J[-1].penalty[0x2c].pc.ptr64 + 1);
          xVar35 = XO_GROUP3b;
          RVar15 = 0;
          local_510.mcp = local_510.mcp + -1;
          goto LAB_00138a5d;
        case '\x1f':
          pcStack_530 = (code *)0x138606;
          asm_neg_not(&local_510,unaff_RBP,XOg_NOT);
          goto switchD_0013780f_caseD_c;
        case ' ':
          pcStack_530 = (code *)0x1382aa;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          uVar47._0_2_ = *(IROpT *)((long)unaff_RBP + 4);
          uVar47._2_2_ = *(IRRef1 *)((long)unaff_RBP + 6);
          uVar54 = -(uint)((0x605fd9U >> (uVar47 & 0x1f) & 1) != 0) & 0x80200;
          *(Reg *)(local_510.mcp + -4) = (RVar15 & 7) << 0x18 | 0xc80f00fd;
          uVar24 = RVar15 >> 3 & 1;
          if ((uVar54 >> 1 & 0xffff) == 0 && uVar24 == 0) {
            local_510.mcp = local_510.mcp + -2;
          }
          else {
            local_510.mcp[-3] = (byte)(uVar54 >> 0x10) | (byte)uVar24 | 0x40;
            local_510.mcp = local_510.mcp + -3;
          }
          pcStack_530 = (code *)0x139c12;
          ra_left(&local_510,RVar15,(uint)(unaff_RBP->field_0).op1);
          goto switchD_0013780f_caseD_c;
        case '!':
          pcStack_530 = (code *)0x138391;
          asm_intarith(&local_510,unaff_RBP,XOg_AND);
          goto switchD_0013780f_caseD_c;
        case '\"':
          pcStack_530 = (code *)0x138918;
          asm_intarith(&local_510,unaff_RBP,XOg_OR);
          goto switchD_0013780f_caseD_c;
        case '#':
          pcStack_530 = (code *)0x138219;
          asm_intarith(&local_510,unaff_RBP,XOg_XOR);
          goto switchD_0013780f_caseD_c;
        case '$':
          pcStack_530 = (code *)0x1386de;
          asm_bitshift(&local_510,unaff_RBP,XOg_SHL,XV_SHLX);
          goto switchD_0013780f_caseD_c;
        case '%':
          pcStack_530 = (code *)0x1385ef;
          asm_bitshift(&local_510,unaff_RBP,XOg_SHR,XV_SHRX);
          goto switchD_0013780f_caseD_c;
        case '&':
          pcStack_530 = (code *)0x138901;
          asm_bitshift(&local_510,unaff_RBP,XOg_SAR,XV_SARX);
          goto switchD_0013780f_caseD_c;
        case '\'':
          xs = XOg_ROL;
          goto LAB_0013892a;
        case '(':
          xs = XOg_ROR;
LAB_0013892a:
          pcStack_530 = (code *)0x138931;
          asm_bitshift(&local_510,unaff_RBP,xs,XOg_FADDq);
          goto switchD_0013780f_caseD_c;
        case ')':
          uVar54 = (unaff_RBP->field_1).t.irt & 0x1f;
          if (uVar54 != 0xe) {
            if ((local_510.flagmcp != local_510.mcp) && ((0x605fd9U >> uVar54 & 1) == 0)) {
              uVar48 = (ulong)(unaff_RBP->field_0).op1;
              uVar30 = (ulong)(unaff_RBP->field_0).op2;
              local_510.mrm.base = 0x80;
              local_510.mrm.idx = 0x80;
              local_510.mrm.scale = '\0';
              local_510.mrm.ofs = 0;
              cVar3 = *(char *)((long)local_510.ir + uVar48 * 8 + 6);
              if (cVar3 < '\0') {
                if ((((unaff_RBP->field_0).op1 != (unaff_RBP->field_0).op2) &&
                    (*(char *)((long)local_510.ir + uVar48 * 8 + 5) == ')')) &&
                   ((local_510.fuseref < (unaff_RBP->field_0).op1 &&
                    ((-1 < (short)(unaff_RBP->field_0).op2 ||
                     (-1 < *(short *)((long)local_510.ir + uVar48 * 8 + 2))))))) {
                  bVar50 = *(byte *)((long)local_510.ir +
                                    (ulong)local_510.ir[uVar48].field_0.op1 * 8 + 6);
                  RVar15 = (Reg)bVar50;
                  if ((char)bVar50 < '\0') {
                    pcStack_530 = (code *)0x13ade8;
                    RVar15 = ra_allocref(&local_510,(uint)local_510.ir[uVar48].field_0.op1,0xbfef);
                  }
                  bVar50 = (byte)RVar15 & 0x1f;
                  uVar54 = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
                  uVar24 = ~(1 << (RVar15 & 0x1f)) & 0xbfef;
                  local_510.mrm.base = (byte)RVar15;
                  if ((short)(unaff_RBP->field_0).op2 < 0) {
                    local_510.mrm.ofs =
                         local_510.ir[*(ushort *)((long)pIVar56 + uVar48 * 8 + 2)].field_1.op12;
                    uVar5 = (unaff_RBP->field_0).op2;
                  }
                  else {
                    local_510.mrm.ofs = pIVar56[uVar30].field_1.op12;
                    uVar5 = *(ushort *)((long)pIVar56 + uVar48 * 8 + 2);
                  }
                  bVar50 = *(byte *)((long)local_510.ir + (ulong)uVar5 * 8 + 6);
                  RVar15 = (Reg)bVar50;
                  local_510.weakset = uVar54;
                  if ((char)bVar50 < '\0') {
                    pcStack_530 = (code *)0x13b148;
                    RVar15 = ra_allocref(&local_510,(uint)uVar5,uVar24);
                  }
                  bVar50 = (byte)RVar15 & 0x1f;
                  local_510.weakset =
                       local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
                  RVar51 = uVar24 & ~(1 << (RVar15 & 0x1f));
                  local_510.mrm.idx = (byte)RVar15;
                  goto LAB_0013b162;
                }
              }
              else {
                RVar51 = ~(1 << ((int)cVar3 & 0x1fU)) & 0xbfef;
                local_510.weakset = local_510.weakset & ~(1 << ((int)cVar3 & 0x1fU));
                local_510.mrm.base = *(undefined1 *)((long)local_510.ir + uVar48 * 8 + 6);
                local_510.mrm.idx = 0x80;
                uVar5 = (unaff_RBP->field_0).op2;
                if (((short)uVar5 < 0) && (*(char *)((long)local_510.ir + uVar30 * 8 + 6) < '\0')) {
                  if (((*(char *)((long)local_510.ir + uVar30 * 8 + 5) == ')') &&
                      (local_510.fuseref < uVar5)) &&
                     (-1 < *(short *)((long)local_510.ir + uVar30 * 8 + 2))) {
                    pcStack_530 = (code *)0x13b0f1;
                    RVar15 = ra_alloc1(&local_510,(uint)local_510.ir[uVar30].field_0.op1,RVar51);
                    RVar51 = RVar51 & ~(1 << (RVar15 & 0x1f));
                    local_510.mrm.idx = (char)RVar15;
                    local_510.mrm.ofs =
                         local_510.ir[*(ushort *)((long)pIVar56 + uVar30 * 8 + 2)].field_1.op12;
LAB_0013b162:
                    pcStack_530 = (code *)0x13b174;
                    RVar15 = ra_dest(&local_510,unaff_RBP,RVar51);
                    xVar35 = XO_LEA;
                    break;
                  }
                }
                else {
                  bVar50 = (unaff_RBP->field_1).r;
                  if (((long)(char)bVar50 < 0) ||
                     ((((*(byte *)((long)local_510.ir + uVar48 * 8 + 4) & 0x40) == 0 ||
                       (local_510.phireg[(char)bVar50] != (unaff_RBP->field_0).op1)) &&
                      (((*(byte *)((long)local_510.ir + uVar30 * 8 + 4) & 0x40) == 0 ||
                       (local_510.phireg[bVar50] != uVar5)))))) {
                    if ((short)uVar5 < 0) {
                      uVar54 = (uint)*(byte *)((long)local_510.ir + uVar30 * 8 + 6);
                      RVar51 = RVar51 & ~(1 << (uVar54 & 0x1f));
                      local_510.weakset = local_510.weakset & ~(1 << (uVar54 & 0x1f));
                      local_510.mrm.idx = *(undefined1 *)((long)local_510.ir + uVar30 * 8 + 6);
                    }
                    else {
                      local_510.mrm.ofs = local_510.ir[uVar30].field_1.op12;
                    }
                    goto LAB_0013b162;
                  }
                }
              }
            }
            goto switchD_0013780f_caseD_35;
          }
          pcStack_530 = (code *)0x1389aa;
          asm_fparith(&local_510,unaff_RBP,XO_ADDSD);
          goto switchD_0013780f_caseD_c;
        case '*':
          if (((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013780f_caseD_36;
          pcStack_530 = (code *)0x138a01;
          asm_fparith(&local_510,unaff_RBP,XO_SUBSD);
          goto switchD_0013780f_caseD_c;
        case '+':
          if (((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) goto switchD_0013780f_caseD_37;
          pcStack_530 = (code *)0x1389ca;
          asm_fparith(&local_510,unaff_RBP,XO_MULSD);
          goto switchD_0013780f_caseD_c;
        case ',':
          bVar50 = (unaff_RBP->field_1).t.irt & 0x1f;
          if (bVar50 != 0xe) {
            id_00 = (bVar50 != 0x15) + IRCALL_lj_carith_divi64;
            goto LAB_00139684;
          }
          pcStack_530 = (code *)0x138983;
          asm_fparith(&local_510,unaff_RBP,XO_DIVSD);
          goto switchD_0013780f_caseD_c;
        case '-':
          bVar50 = (unaff_RBP->field_1).t.irt & 0x1f;
          if (bVar50 == 0x13) {
            local_138.u64._0_6_ = CONCAT24((unaff_RBP->field_0).op2,(uint)(unaff_RBP->field_0).op1);
            pCVar34 = lj_ir_callinfo + 0x2c;
LAB_00138b65:
            local_138.u64._6_2_ = 0;
            pcStack_530 = (code *)0x138b78;
            asm_setupresult(&local_510,unaff_RBP,pCVar34);
            goto LAB_00138b7e;
          }
          id_00 = (bVar50 != 0x15) + IRCALL_lj_carith_modi64;
          goto LAB_00139684;
        case '.':
          bVar50 = (unaff_RBP->field_1).t.irt & 0x1f;
          if (bVar50 == 0xe) {
            local_138.u64._0_6_ = CONCAT24((unaff_RBP->field_0).op2,(uint)(unaff_RBP->field_0).op1);
            pCVar34 = lj_ir_callinfo + 0x41;
            goto LAB_00138b65;
          }
          id_00 = (bVar50 != 0x15) + IRCALL_lj_carith_powi64;
          goto LAB_00139684;
        case '/':
          if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
            pcStack_530 = (code *)0x138bed;
            asm_fparith(&local_510,unaff_RBP,XO_XORPS);
          }
          else {
            pcStack_530 = (code *)0x139738;
            asm_neg_not(&local_510,unaff_RBP,XOg_NEG);
          }
          goto switchD_0013780f_caseD_c;
        case '0':
          pcStack_530 = (code *)0x1388e5;
          asm_fparith(&local_510,unaff_RBP,XO_ANDPS);
          goto switchD_0013780f_caseD_c;
        case '1':
          bVar50 = (unaff_RBP->field_1).s;
          iVar55 = (uint)bVar50 * 4;
          bVar14 = (unaff_RBP->field_1).r;
          if (-1 < (char)bVar14) {
            uVar54 = 1 << (bVar14 & 0x1f);
            local_510.modset = local_510.modset | uVar54;
            local_510.freeset = local_510.freeset | uVar54;
            pcStack_530 = (code *)0x138724;
            emit_rmro(&local_510,XO_MOVSD,(int)(char)bVar14,4,iVar55);
          }
          if (bVar50 == 0) {
            bVar50 = 0x1c;
          }
          else if (bVar50 < 0x20) {
            local_510.mcp[-1] = (byte)iVar55;
            local_510.mcp = local_510.mcp + -1;
            bVar50 = 0x5c;
          }
          else {
            *(int *)(local_510.mcp + -4) = iVar55;
            local_510.mcp = local_510.mcp + -4;
            bVar50 = 0x9c;
          }
          local_510.mcp[-1] = 0x24;
          local_510.mcp[-2] = bVar50;
          local_510.mcp[-3] = 0xdd;
          local_510.mcp[-5] = 0xdd;
          local_510.mcp[-4] = 0xd9;
          local_510.mcp[-7] = 0xd9;
          local_510.mcp[-6] = 0xfd;
          local_510.mcp = local_510.mcp + -7;
          pcStack_530 = (code *)0x139cee;
          asm_x87load(&local_510,(uint)(unaff_RBP->field_0).op1);
          pcStack_530 = (code *)0x139cfa;
          asm_x87load(&local_510,(uint)(unaff_RBP->field_0).op2);
          goto switchD_0013780f_caseD_c;
        case '2':
          if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
            pcStack_530 = (code *)0x13836b;
            asm_fparith(&local_510,unaff_RBP,XO_MINSD);
          }
          else {
            pcStack_530 = (code *)0x1394d4;
            asm_intmin_max(&local_510,unaff_RBP,0xf);
          }
          goto switchD_0013780f_caseD_c;
        case '3':
          if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
            pcStack_530 = (code *)0x1386c2;
            asm_fparith(&local_510,unaff_RBP,XO_MAXSD);
          }
          else {
            pcStack_530 = (code *)0x1394e3;
            asm_intmin_max(&local_510,unaff_RBP,0xc);
          }
          goto switchD_0013780f_caseD_c;
        case '4':
          uVar5 = (unaff_RBP->field_0).op2;
          if (uVar5 == 3) {
            pcStack_530 = (code *)0x138b18;
            RVar17 = ra_dest(&local_510,unaff_RBP,0xffff0000);
            pcStack_530 = (code *)0x138b2c;
            RVar15 = asm_fuseload(&local_510,(uint)(unaff_RBP->field_0).op1,0xffff0000);
            xVar35 = XO_SQRTSD;
            goto LAB_0013b052;
          }
          if (uVar5 < 3) {
            if ((local_510.flags & 0x20) == 0) {
              bVar50 = (unaff_RBP->field_1).r & 0x1f;
              RVar51 = (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50) & 0xf0001;
              if ((char)(unaff_RBP->field_1).r < '\0') {
                RVar51 = 0xf0001;
              }
              pcStack_530 = (code *)0x13962a;
              ra_evictset(&local_510,RVar51);
              pcStack_530 = (code *)0x13963a;
              ra_destreg(&local_510,unaff_RBP,0x10);
              pcVar28 = lj_vm_trunc_sse;
              if (uVar5 == 1) {
                pcVar28 = lj_vm_ceil_sse;
              }
              target = lj_vm_floor_sse;
              if (uVar5 != 0) {
                target = pcVar28;
              }
              pcStack_530 = (code *)0x139664;
              emit_call_(&local_510,(MCode *)target);
              pcStack_530 = (code *)0x139675;
              ra_left(&local_510,0x10,(uint)(unaff_RBP->field_0).op1);
            }
            else {
              pcStack_530 = (code *)0x13a4fc;
              RVar15 = ra_dest(&local_510,unaff_RBP,0xffff0000);
              pcStack_530 = (code *)0x13a510;
              RVar17 = asm_fuseload(&local_510,(uint)(unaff_RBP->field_0).op1,0xffff0000);
              local_510.mcp[-1] = (char)uVar5 + 9;
              pcStack_530 = (code *)0x13a53a;
              local_510.mcp = local_510.mcp + -1;
              emit_mrm(&local_510,XO_ROUNDSD,RVar15,RVar17);
              pMVar12 = local_510.mcp;
              if (local_510.mcp[1] != 0x3a) {
                *local_510.mcp = local_510.mcp[1];
                local_510.mcp[1] = 0xf;
              }
              local_510.mcp = local_510.mcp + -1;
              pMVar12[-1] = 0x66;
            }
          }
          else {
            pcStack_530 = (code *)0x139f2c;
            asm_callid(&local_510,unaff_RBP,uVar5 + IRCALL_lj_vm_floor);
          }
          goto switchD_0013780f_caseD_c;
        case '5':
switchD_0013780f_caseD_35:
          pcStack_530 = (code *)0x13abd0;
          asm_intarith(&local_510,unaff_RBP,XOg_ADD);
          goto switchD_0013780f_caseD_c;
        case '6':
switchD_0013780f_caseD_36:
          pcStack_530 = (code *)0x138a18;
          asm_intarith(&local_510,unaff_RBP,XOg_SUB);
          goto switchD_0013780f_caseD_c;
        case '7':
switchD_0013780f_caseD_37:
          pcStack_530 = (code *)0x1389e1;
          asm_intarith(&local_510,unaff_RBP,XOg_X_IMUL);
          goto switchD_0013780f_caseD_c;
        case '8':
          pcStack_530 = (code *)0x137f57;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          pcStack_530 = (code *)0x137f69;
          asm_fusearef(&local_510,unaff_RBP,0xbfef);
          RVar15 = RVar15 | 0x80200;
          xVar35 = XO_LEA;
          break;
        case '9':
          local_528.gcr.gcptr64._2_6_ = 0;
          local_528.field_0.op1 = local_510.ir[(unaff_RBP->field_0).op2].field_0.op1;
          uVar5 = *(ushort *)((long)local_510.ir + (ulong)(unaff_RBP->field_0).op2 * 8 + 2);
          if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
            RVar15 = 0x80;
          }
          else {
            pcStack_530 = (code *)0x13854f;
            RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          }
          bVar50 = *(byte *)((long)local_510.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
          uVar30 = (ulong)bVar50;
          if ((char)bVar50 < '\0') {
            pcStack_530 = (code *)0x138576;
            RVar17 = ra_allocref(&local_510,(uint)(unaff_RBP->field_0).op1,0xbfef);
            uVar30 = (ulong)RVar17;
          }
          iVar55 = (uint)uVar5 * 0x18;
          RVar17 = (Reg)uVar30;
          bVar50 = (byte)uVar30;
          local_510.weakset =
               local_510.weakset & (-2 << (bVar50 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar50 & 0x1f));
          if (RVar15 < 0x80) {
            if (uVar5 == 0) {
              if (RVar15 != RVar17) {
                local_510.mcp[-1] = (bVar50 & 7) + (char)RVar15 * '\b' | 0xc0;
                local_510.mcp[-2] = 0x8b;
                local_510.mcp[-3] = (byte)(uVar30 >> 3) & 1 | (byte)(RVar15 >> 1) & 4 | 0x48;
                local_510.mcp = local_510.mcp + -3;
              }
            }
            else if (RVar15 == RVar17) {
              pcStack_530 = (code *)0x1385d3;
              emit_gri(&local_510,0x838100,RVar15 | 0x80200,iVar55);
            }
            else {
              pcStack_530 = (code *)0x13a27c;
              emit_rmro(&local_510,XO_LEA,RVar15 | 0x80200,RVar17,iVar55);
            }
          }
          pcStack_530 = (code *)0x13a28b;
          asm_guardcc(&local_510,5);
          IVar31 = local_528;
          bVar14 = *(byte *)((long)pIVar56 + (long)local_528 * 8 + 4) & 0x1f;
          if (bVar14 < 3) {
            *(uint *)(local_510.mcp + -4) = (int)(char)~bVar14 << 0xf | 0x7fff;
            local_510.mcp = local_510.mcp + -4;
            unaff_RBP = (IRIns *)(ulong)(iVar55 + 0xcU);
            pcStack_530 = (code *)0x13a2d8;
            emit_rmro(&local_510,XO_ARITHi,7,RVar17,iVar55 + 0xcU);
          }
          else {
            pcStack_530 = (code *)0x13a2f7;
            RVar15 = ra_scratch(&local_510,~(1 << (bVar50 & 0x1f)) & 0xbfef);
            unaff_RBP = (IRIns *)(ulong)(iVar55 + 8U);
            pcStack_530 = (code *)0x13a317;
            emit_rmro(&local_510,XO_CMP,RVar15 | 0x80200,RVar17,iVar55 + 8U);
            bVar50 = *(byte *)((long)pIVar56 + (long)IVar31 * 8 + 4) & 0x1f;
            if (bVar50 == 0xe) {
              IVar31 = pIVar56[(long)IVar31 + 1];
            }
            else {
              IVar31.field_0 = (long)(char)~bVar50 << 0x2f | pIVar56[(long)IVar31 + 1];
            }
            pcStack_530 = (code *)0x13a345;
            emit_loadu64(&local_510,RVar15,(uint64_t)IVar31);
          }
          goto switchD_0013780f_caseD_c;
        case ':':
          pcStack_530 = (code *)0x138c01;
          asm_href(&local_510,unaff_RBP,IR_LT);
          goto switchD_0013780f_caseD_c;
        case ';':
          if ((unaff_RBP->field_1).r != 0xfe) {
            pcStack_530 = (code *)0x137ea3;
            asm_snap_prep(&local_510);
            local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
            local_138.field_4.i = 0x7fff;
            local_138.u64._6_2_ = 0;
            local_130 = 0x7ffd;
            pcStack_530 = (code *)0x137ed7;
            asm_setupresult(&local_510,unaff_RBP,lj_ir_callinfo + 0x23);
            pcStack_530 = (code *)0x137ee5;
            asm_gencall(&local_510,lj_ir_callinfo + 0x23,(IRRef *)&local_138.u64);
            RVar15 = (Reg)*(byte *)((long)local_510.ir + 0x3ffee);
            uVar54 = 1 << (*(byte *)((long)local_510.ir + 0x3ffee) & 0x1f);
            local_510.modset = local_510.modset | uVar54;
            local_510.freeset = local_510.freeset | uVar54;
            *(undefined1 *)((long)local_510.ir + 0x3ffee) = 0xff;
            ref = (IRRef)(unaff_RBP->field_0).op2;
            goto LAB_0013971d;
          }
          goto switchD_0013780f_caseD_c;
        case '<':
        case '=':
          pcStack_530 = (code *)0x137936;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          bVar50 = (unaff_RBP->field_1).t.irt & 0x9f;
          if ((long)(short)(unaff_RBP->field_0).op1 < 0 || bVar50 == 0x89) {
            pcStack_530 = (code *)0x13796a;
            RVar17 = ra_scratch(&local_510,0xbfef);
            if ((unaff_RBP->field_1).o == '=') {
              xVar35 = XO_LEA;
              iVar41 = 0x10;
            }
            else {
              xVar35 = XO_MOV;
              iVar41 = 0x20;
            }
            pcStack_530 = (code *)0x139393;
            emit_rmro(&local_510,xVar35,RVar15 | 0x80200,RVar17,iVar41);
            if (bVar50 == 0x89) {
              pcStack_530 = (code *)0x1393b3;
              asm_guardcc(&local_510,(unaff_RBP->field_1).o == '=' ^ 5);
              local_510.mcp[-1] = 0;
              pcStack_530 = (code *)0x1393e3;
              local_510.mcp = local_510.mcp + -1;
              emit_rmro(&local_510,XO_ARITHib,7,RVar17,10);
            }
            uVar5 = (unaff_RBP->field_0).op1;
            if ((short)uVar5 < 0) {
              bVar50 = *(byte *)((long)local_510.ir + (ulong)uVar5 * 8 + 6);
              RVar15 = (Reg)bVar50;
              if ((char)bVar50 < '\0') {
                pcStack_530 = (code *)0x1399d9;
                RVar15 = ra_allocref(&local_510,(uint)uVar5,0xbfef);
              }
              bVar50 = (byte)RVar15 & 0x1f;
              local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              pcStack_530 = (code *)0x139a0b;
              emit_rmro(&local_510,XO_MOV,RVar17 | 0x80200,RVar15,
                        (uint)*(byte *)((long)&(unaff_RBP->field_0).op2 + 1) * 8 + 0x28);
            }
            else {
              pcStack_530 = (code *)0x139411;
              emit_loadu64(&local_510,RVar17,
                           *(uint64_t *)
                            ((long)local_510.ir[(ulong)uVar5 + 1] + 0x28 +
                            (ulong)*(byte *)((long)&(unaff_RBP->field_0).op2 + 1) * 8));
            }
          }
          else {
            addr = (void *)(*(long *)((long)local_510.ir[(long)(short)(unaff_RBP->field_0).op1 + 1]
                                      + 0x28 + (ulong)*(byte *)((long)&(unaff_RBP->field_0).op2 + 1)
                                               * 8) + 0x20);
            RVar15 = RVar15 | 0x80200;
            xVar35 = XO_MOV;
LAB_00138a5d:
            pcStack_530 = (code *)0x138a62;
            emit_rma(&local_510,xVar35,RVar15,addr);
          }
          goto switchD_0013780f_caseD_c;
        case '>':
          pcStack_530 = (code *)0x138ad3;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          pcStack_530 = (code *)0x138ae6;
          asm_fusefref(&local_510,unaff_RBP,0xbfef);
          xVar35 = XO_LEA;
          break;
        case '?':
          pcStack_530 = (code *)0x138124;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          pcStack_530 = (code *)0x138136;
          asm_tvptr(&local_510,RVar15,(uint)(unaff_RBP->field_0).op1,(uint)(unaff_RBP->field_0).op2)
          ;
          goto switchD_0013780f_caseD_c;
        case '@':
          pcStack_530 = (code *)0x13808b;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          local_510.mrm.base = 0x80;
          local_510.mrm.idx = 0x80;
          local_510.mrm.scale = '\0';
          local_510.mrm.ofs = 0x18;
          bVar50 = *(byte *)((long)local_510.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
          if ((char)bVar50 < '\0') {
            pcStack_530 = (code *)0x1380cd;
            RVar17 = ra_allocref(&local_510,(uint)(unaff_RBP->field_0).op1,0xbfef);
            bVar50 = (byte)RVar17;
          }
          local_510.weakset =
               local_510.weakset & (-2 << (bVar50 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar50 & 0x1f));
          local_510.mrm.base = bVar50;
          uVar5 = (unaff_RBP->field_0).op2;
          if ((short)uVar5 < 0) {
            bVar14 = *(byte *)((long)local_510.ir + (ulong)uVar5 * 8 + 6);
            if ((char)bVar14 < '\0') {
              pcStack_530 = (code *)0x139b1c;
              RVar17 = ra_allocref(&local_510,(uint)uVar5,~(1 << (bVar50 & 0x1f)) & 0xbfef);
              bVar14 = (byte)RVar17;
            }
            local_510.weakset =
                 local_510.weakset & (-2 << (bVar14 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar14 & 0x1f))
            ;
            local_510.mrm.idx = bVar14;
          }
          else {
            local_510.mrm.ofs = local_510.mrm.ofs + local_510.ir[uVar5].field_1.op12;
          }
          if (local_510.mrm.base == 0x80) {
            pcStack_530 = (code *)0x13a0bd;
            emit_loadi(&local_510,RVar15,local_510.mrm.ofs);
            goto switchD_0013780f_caseD_c;
          }
          RVar15 = RVar15 | 0x80200;
          xVar35 = XO_LEA;
          break;
        case 'A':
          pcStack_530 = (code *)0x137f2e;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          pcStack_530 = (code *)0x137f3d;
          ra_left(&local_510,RVar15,0x7fff);
          goto switchD_0013780f_caseD_c;
        case 'B':
        case 'C':
        case 'D':
        case 'H':
          if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
            if (((unaff_RBP->field_1).t.irt & 0x1f) - 3 < 10) {
              pcStack_530 = (code *)0x13936e;
              RVar15 = ra_scratch(&local_510,0xbfef);
              uVar30 = (ulong)RVar15;
              RVar51 = ~(1 << (RVar15 & 0x1f)) & 0xbfef;
            }
            else {
              RVar51 = 0xbfef;
              uVar30 = 0x80;
            }
            pcStack_530 = (code *)0x139d1b;
            asm_fuseahuref(&local_510,(uint)(unaff_RBP->field_0).op1,RVar51);
            if ((unaff_RBP->field_1).o == 'H') {
              local_510.mrm.ofs = local_510.mrm.ofs + (uint)(unaff_RBP->field_0).op2 * 8;
            }
          }
          else {
            RVar51 = 0xffff0000;
            if (((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) {
              RVar51 = 0xbfef;
            }
            pcStack_530 = (code *)0x137857;
            RVar15 = ra_dest(&local_510,unaff_RBP,RVar51);
            pcStack_530 = (code *)0x13786a;
            asm_fuseahuref(&local_510,(uint)(unaff_RBP->field_0).op1,0xbfef);
            if ((unaff_RBP->field_1).o == 'H') {
              local_510.mrm.ofs = local_510.mrm.ofs + (uint)(unaff_RBP->field_0).op2 * 8;
            }
            uVar54 = ((unaff_RBP->field_1).t.irt & 0x1f) - 0xd;
            if (uVar54 < 0xfffffff6) {
              xVar35 = XO_MOVSD;
              if (RVar15 < 0x10) {
                xVar35 = XO_MOV;
              }
            }
            else {
              local_510.mcp[-1] = 0x11;
              bVar50 = (byte)RVar15 & 7;
              local_510.mcp[-2] = bVar50 - 0x18;
              local_510.mcp[-3] = 0xc1;
              uVar24 = RVar15 >> 3 & 1;
              iVar55 = uVar24 + 0x48;
              local_528.field_1.op12 = iVar55;
              local_510.mcp[-4] = (byte)iVar55;
              local_510.mcp = local_510.mcp + -4;
              pcStack_530 = (code *)0x137b41;
              asm_guardcc(&local_510,5);
              local_510.mcp[-1] = ~(unaff_RBP->field_1).t.irt | 0xe0;
              local_510.mcp[-2] = (byte)RVar15 | 0xf8;
              local_510.mcp[-3] = 0x83;
              lVar26 = -2;
              if (uVar24 != 0) {
                local_510.mcp[-4] = 0x41;
                lVar26 = -3;
              }
              local_510.mcp[lVar26 + -2] = 0x66;
              local_510.mcp[lVar26 + -3] = 0x2f;
              if ((local_510.flags & 0x40) == 0) {
                local_510.mcp[lVar26 + -4] = bVar50 | 200;
                local_510.mcp[lVar26 + -5] = 0xc1;
                local_510.mcp[lVar26 + -6] = (byte)local_528.field_0.op1;
                RVar15 = RVar15 | 0x80200;
                xVar35 = XO_MOV;
                local_510.mcp = local_510.mcp + lVar26 + -6;
              }
              else {
                xVar35 = 0xf0fbe3c4;
                local_510.mcp = local_510.mcp + lVar26 + -3;
              }
            }
            pcStack_530 = (code *)0x13915d;
            emit_mrm(&local_510,xVar35,RVar15,0x20);
            uVar30 = 0x80;
            if (0xfffffff5 < uVar54) goto switchD_0013780f_caseD_c;
          }
          local_510.mrm.ofs = local_510.mrm.ofs + 4;
          pcStack_530 = (code *)0x139190;
          asm_guardcc(&local_510,(uint)(((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) * 2 + 3);
          uVar54 = (unaff_RBP->field_1).t.irt & 0x1f;
          if ((byte)uVar54 < 0xe) {
            if (uVar54 - 3 < 10) {
              local_510.mrm.ofs = local_510.mrm.ofs - 4;
              local_510.mcp[-1] = ~(unaff_RBP->field_1).t.irt | 0xe0;
              pcStack_530 = (code *)0x139216;
              local_510.mcp = local_510.mcp + -1;
              emit_mrm(&local_510,XO_ARITHi8,7,(uint)uVar30);
              local_510.mcp[-1] = 0x2f;
              local_510.mcp[-2] = (byte)uVar30 | 0xf8;
              local_510.mcp[-3] = 0xc1;
              local_510.mcp[-4] = (byte)(uVar30 >> 3) & 1 | 0x48;
              RVar15 = (uint)uVar30 | 0x80200;
              xVar35 = XO_MOV;
LAB_0013a175:
              local_510.mcp = local_510.mcp + -4;
            }
            else {
              if ((byte)uVar54 != 0) {
                *(uint *)(local_510.mcp + -4) = ~uVar54 << 0xf | 0x7fff;
                goto LAB_00139337;
              }
              local_510.mrm.ofs = local_510.mrm.ofs - 4;
              local_510.mcp[-1] = 0xff;
              xVar35 = XO_ARITHi8;
              RVar15 = 0x80207;
              local_510.mcp = local_510.mcp + -1;
            }
          }
          else {
            if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
            pbVar33 = local_510.mcp + -4;
            pbVar33[0] = 0;
            pbVar33[1] = 0;
            pbVar33[2] = 0xf9;
            pbVar33[3] = 0xff;
LAB_00139337:
            local_510.mcp = local_510.mcp + -4;
            xVar35 = XO_ARITHi;
            RVar15 = 7;
          }
          break;
        case 'E':
        case 'F':
          pcStack_530 = (code *)0x137ada;
          asm_fxload(&local_510,unaff_RBP);
          goto switchD_0013780f_caseD_c;
        case 'G':
          uVar5 = (unaff_RBP->field_0).op1;
          uVar52 = (uint)uVar5 * 8 + -0x10;
          bVar50 = (byte)(unaff_RBP->field_0).ot;
          if (((bVar50 & 0x9f) == 0x93 & (byte)(unaff_RBP->field_0).op2 >> 3) == 1) {
            pcStack_530 = (code *)0x138e74;
            RVar15 = ra_scratch(&local_510,0xffff0000);
            pcStack_530 = (code *)0x138e84;
            asm_tointg(&local_510,unaff_RBP,RVar15);
            RVar17 = (Reg)*(byte *)((long)local_510.ir + 0x40006);
            if ((char)*(byte *)((long)local_510.ir + 0x40006) < '\0') {
              pcStack_530 = (code *)0x138eaa;
              RVar17 = ra_allocref(&local_510,0x8000,0xbfef);
            }
            bVar50 = (byte)RVar17 & 0x1f;
            local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
            pcStack_530 = (code *)0x138ed2;
            emit_rmro(&local_510,XO_MOVSD,RVar15,RVar17,uVar52);
            bVar50 = 0xe;
          }
          else if (((char)(unaff_RBP->field_1).r < '\0') && ((unaff_RBP->field_1).s == '\0')) {
            if (((unaff_RBP->field_0).op2 & 4) == 0) goto switchD_0013780f_caseD_c;
            RVar17 = (Reg)*(byte *)((long)local_510.ir + 0x40006);
            if ((char)*(byte *)((long)local_510.ir + 0x40006) < '\0') {
              pcStack_530 = (code *)0x13ab6a;
              RVar17 = ra_allocref(&local_510,0x8000,0xbfef);
            }
            bVar14 = (byte)RVar17 & 0x1f;
            local_510.weakset = local_510.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
          }
          else {
            bVar14 = (byte)(bVar50 & 0x1f);
            RVar51 = 0xbfef;
            if (bVar14 == 0xe) {
              RVar51 = 0xffff0000;
            }
            pcStack_530 = (code *)0x1397ff;
            RVar15 = ra_dest(&local_510,unaff_RBP,RVar51);
            RVar17 = (Reg)*(byte *)((long)local_510.ir + 0x40006);
            if ((char)*(byte *)((long)local_510.ir + 0x40006) < '\0') {
              pcStack_530 = (code *)0x13982b;
              RVar17 = ra_allocref(&local_510,0x8000,0xbfef);
            }
            bVar37 = (byte)RVar17 & 0x1f;
            local_510.weakset = local_510.weakset & (-2 << bVar37 | 0xfffffffeU >> 0x20 - bVar37);
            if (((unaff_RBP->field_0).op2 & 8) == 0) {
              if (9 < (bVar50 & 0x1f) - 3) {
                xVar35 = XO_MOV;
                if (bVar14 == 0xe) {
                  xVar35 = XO_MOVSD;
                }
                goto LAB_0013a5e9;
              }
              local_528.i = uVar52;
              local_510.mcp[-1] = 0x11;
              uVar30 = (ulong)RVar15 & 0xffffffffffffff07;
              local_510.mcp[-2] = (char)uVar30 - 0x18;
              local_510.mcp[-3] = 0xc1;
              uVar54 = RVar15 >> 3 & 1;
              iVar55 = uVar54 + 0x48;
              local_510.mcp[-4] = (byte)iVar55;
              local_510.mcp = local_510.mcp + -4;
              if (((unaff_RBP->field_0).op2 & 4) != 0) {
                pcStack_530 = (code *)0x1398d6;
                local_520 = RVar15;
                local_51c = iVar55;
                local_518 = uVar30;
                asm_guardcc(&local_510,5);
                local_510.mcp[-1] = ~bVar14;
                local_510.mcp[-2] = (byte)local_520 | 0xf8;
                local_510.mcp[-3] = 0x83;
                lVar26 = -2;
                if (uVar54 != 0) {
                  local_510.mcp[-4] = 0x41;
                  lVar26 = -3;
                }
                local_510.mcp = local_510.mcp + lVar26 + -2;
                *local_510.mcp = 0x66;
                uVar30 = local_518;
                RVar15 = local_520;
                iVar55 = local_51c;
              }
              if ((local_510.flags & 0x40) == 0) {
                bVar58 = ((unaff_RBP->field_0).op2 & 4) == 0;
                bVar14 = 0x2f;
                if (bVar58) {
                  bVar14 = 0x11;
                }
                bVar37 = 200;
                if (bVar58) {
                  bVar37 = 0xe0;
                }
                local_510.mcp[-1] = bVar14;
                local_510.mcp[-2] = (byte)uVar30 | bVar37;
                local_510.mcp[-3] = 0xc1;
                local_510.mcp[-4] = (byte)iVar55;
                RVar15 = RVar15 | 0x80200;
                xVar35 = XO_MOV;
                local_510.mcp = local_510.mcp + -4;
              }
              else {
                local_510.mcp[-1] = 0x2f;
                xVar35 = 0xf0fbe3c4;
                local_510.mcp = local_510.mcp + -1;
              }
              uVar52 = local_528._0_4_;
              pcStack_530 = (code *)0x13ac06;
              emit_rmro(&local_510,xVar35,RVar15,RVar17,local_528._0_4_);
              bVar58 = false;
            }
            else {
              bVar50 = (bVar14 != 0x13) * '\x05' + 0xe;
              xVar35 = (uint)(bVar14 == 0x13) * 0x2000000 + XO_CVTSI2SD;
LAB_0013a5e9:
              pcStack_530 = (code *)0x13a5fb;
              emit_rmro(&local_510,xVar35,RVar15,RVar17,uVar52);
              bVar58 = true;
            }
            if (!bVar58) goto switchD_0013780f_caseD_c;
          }
          if (((unaff_RBP->field_0).op2 & 4) != 0) {
            bVar50 = bVar50 & 0x1f;
            pcStack_530 = (code *)0x13ac3c;
            asm_guardcc(&local_510,(uint)(bVar50 != 0xe) * 2 + 3);
            if ((bVar50 < 0xe) && (((unaff_RBP->field_0).op2 & 0x40) == 0)) {
              if (bVar50 == 0) {
                local_510.mcp[-1] = 0xff;
                xVar35 = XO_ARITHi8;
                uVar54 = 0x80207;
                local_510.mcp = local_510.mcp + -1;
              }
              else {
                if (bVar50 < 3) {
                  *(uint *)(local_510.mcp + -4) = (int)(char)~bVar50 << 0xf | 0x7fff;
                  goto LAB_0013acb3;
                }
                pcStack_530 = (code *)0x13ae45;
                RVar15 = ra_scratch(&local_510,~(1 << (RVar17 & 0x1f)) & 0xbfef);
                local_510.mcp[-1] = ~bVar50;
                bVar50 = (byte)RVar15 | 0xf8;
                local_510.mcp[-2] = bVar50;
                local_510.mcp[-3] = 0x83;
                lVar26 = -2;
                uVar54 = RVar15 >> 3 & 1;
                if (uVar54 != 0) {
                  local_510.mcp[-4] = 0x41;
                  lVar26 = -3;
                }
                local_510.mcp[lVar26 + -2] = 0x2f;
                local_510.mcp[lVar26 + -3] = bVar50;
                local_510.mcp[lVar26 + -4] = 0xc1;
                local_510.mcp[lVar26 + -5] = (byte)uVar54 | 0x48;
                uVar54 = RVar15 | 0x80200;
                xVar35 = XO_MOV;
                local_510.mcp = local_510.mcp + lVar26 + -5;
              }
              pcStack_530 = (code *)0x13aed7;
              emit_rmro(&local_510,xVar35,uVar54,RVar17,uVar52);
            }
            else {
              uVar52 = 0xfffe7fff;
              if (((unaff_RBP->field_0).op2 & 0x40) == 0) {
                uVar52 = 0xfff90000;
              }
              *(undefined4 *)(local_510.mcp + -4) = uVar52;
LAB_0013acb3:
              local_510.mcp = local_510.mcp + -4;
              pcStack_530 = (code *)0x13accb;
              emit_rmro(&local_510,XO_ARITHi,7,RVar17,(uint)uVar5 * 8 + -0xc);
            }
          }
          goto switchD_0013780f_caseD_c;
        case 'I':
          id_00 = (unaff_RBP->field_0).op2 == 0x7fff ^ IRCALL_lj_tab_len_hint;
LAB_00139684:
          pcStack_530 = (code *)0x139691;
          asm_callid(&local_510,unaff_RBP,id_00);
          goto switchD_0013780f_caseD_c;
        case 'J':
        case 'K':
        case 'L':
          if ((unaff_RBP->field_1).r == 0xfe) goto switchD_0013780f_caseD_c;
          uVar5 = (unaff_RBP->field_0).op2;
          uVar30 = (ulong)uVar5;
          if (((unaff_RBP->field_1).t.irt & 0x1f) == 0xe) {
            bVar50 = *(byte *)((long)local_510.ir + uVar30 * 8 + 6);
            RVar15 = (Reg)bVar50;
            if ((char)bVar50 < '\0') {
              pcStack_530 = (code *)0x1378ee;
              RVar15 = ra_allocref(&local_510,(uint)uVar5,0xffff0000);
            }
            bVar50 = (byte)RVar15 & 0x1f;
            local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
            pcStack_530 = (code *)0x137917;
            asm_fuseahuref(&local_510,(uint)(unaff_RBP->field_0).op1,0xbfef);
            xVar35 = XO_MOVSDto;
          }
          else {
            if (-1 < (short)uVar5) {
              pcStack_530 = (code *)0x1392a5;
              lj_ir_kvalue((local_510.J)->L,&local_138,
                           (IRIns *)((ulong)((uint)uVar5 * 8) + (long)local_510.ir));
              pcStack_530 = (code *)0x1392b6;
              asm_fuseahuref(&local_510,(uint)(unaff_RBP->field_0).op1,0xbfef);
              if (local_138.u64 == 0xffffffffffffffff) {
                RVar15 = 0x80200;
                uVar52 = 0xffffffff;
              }
              else {
                *(int32_t *)(local_510.mcp + -4) = local_138.field_4.i;
                local_510.mcp = local_510.mcp + -4;
                RVar15 = 0;
                pcStack_530 = (code *)0x1392f7;
                emit_mrm(&local_510,XO_MOVmi,0,0x20);
                local_510.mrm.ofs = local_510.mrm.ofs + 4;
                uVar52 = local_138.field_4.it;
              }
              *(undefined4 *)(local_510.mcp + -4) = uVar52;
              xVar35 = XO_MOVmi;
              goto LAB_0013a175;
            }
            bVar50 = *(byte *)((long)local_510.ir + uVar30 * 8 + 6);
            RVar15 = (Reg)bVar50;
            if ((char)bVar50 < '\0') {
              pcStack_530 = (code *)0x139d5c;
              RVar15 = ra_allocref(&local_510,(uint)uVar5,0xbfef);
            }
            bVar50 = (byte)RVar15 & 0x1f;
            local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
            pcStack_530 = (code *)0x139d86;
            asm_fuseahuref(&local_510,(uint)(unaff_RBP->field_0).op1,
                           ~(1 << (RVar15 & 0x1f)) & 0xbfef);
            if (RVar15 < 0x80) {
              local_510.mrm.ofs = local_510.mrm.ofs + 4;
              *(int *)(local_510.mcp + -4) = (int)(char)(~(unaff_RBP->field_1).t.irt | 0xe0) << 0xf;
              local_510.mcp = local_510.mcp + -4;
              pcStack_530 = (code *)0x139dd5;
              emit_mrm(&local_510,XO_ARITHi,1,0x20);
              local_510.mrm.ofs = local_510.mrm.ofs - 4;
              RVar15 = RVar15 | 0x80200;
              xVar35 = XO_MOVto;
            }
            else {
              if (2 < (*(byte *)((long)pIVar56 + uVar30 * 8 + 4) & 0x1f)) {
                *(IRRef2 *)(local_510.mcp + -4) = pIVar56[uVar30].field_1.op12;
                local_510.mcp = local_510.mcp + -4;
                pcStack_530 = (code *)0x13a46a;
                emit_mrm(&local_510,XO_MOVmi,0,0x20);
              }
              local_510.mrm.ofs = local_510.mrm.ofs + 4;
              pbVar33 = local_510.mcp + -4;
              pbVar33[0] = 0;
              pbVar33[1] = 0;
              pbVar33[2] = 0xf9;
              pbVar33[3] = 0xff;
              xVar35 = XO_MOVmi;
              RVar15 = 0;
              local_510.mcp = local_510.mcp + -4;
            }
          }
          break;
        case 'M':
        case 'N':
          pcStack_530 = (code *)0x137ac8;
          asm_fxstore(&local_510,unaff_RBP);
          goto switchD_0013780f_caseD_c;
        case 'O':
        case 'P':
          pcStack_530 = (code *)0x137a8a;
          asm_snap_prep(&local_510);
          local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
          local_130 = (uint32_t)(unaff_RBP->field_0).op2;
          local_510.gcsteps = local_510.gcsteps + 1;
          pCVar34 = lj_ir_callinfo + 2;
          goto LAB_00138cdf;
        case 'Q':
          pcStack_530 = (code *)0x13818c;
          asm_snap_prep(&local_510);
          local_138.n = 6.95271921071662e-310;
          local_510.gcsteps = local_510.gcsteps + 1;
          pcStack_530 = (code *)0x1381bc;
          asm_setupresult(&local_510,unaff_RBP,lj_ir_callinfo + 0x20);
          pcStack_530 = (code *)0x1381ca;
          asm_gencall(&local_510,lj_ir_callinfo + 0x20,(IRRef *)&local_138.u64);
          bVar50 = *(byte *)((long)local_510.ir + 0x3ffee);
          uVar54 = 1 << (bVar50 & 0x1f);
          local_510.modset = local_510.modset | uVar54;
          local_510.freeset = local_510.freeset | uVar54;
          *(undefined1 *)((long)local_510.ir + 0x3ffee) = 0xff;
          uVar54 = (uint)(unaff_RBP->field_0).op2 << 0x18 | (uint)(unaff_RBP->field_0).op1;
          goto LAB_0013a424;
        case 'R':
          pcStack_530 = (code *)0x138cbb;
          asm_snap_prep(&local_510);
          local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
          local_510.gcsteps = local_510.gcsteps + 1;
          pCVar34 = lj_ir_callinfo + 0x21;
LAB_00138cdf:
          local_138.field_4.i = 0x7fff;
          local_138.u64._6_2_ = 0;
          pcStack_530 = (code *)0x138ced;
          asm_setupresult(&local_510,unaff_RBP,pCVar34);
          pcStack_530 = (code *)0x138cfb;
          asm_gencall(&local_510,pCVar34,(IRRef *)&local_138.u64);
          goto switchD_0013780f_caseD_c;
        case 'S':
        case 'T':
          id = local_510.ir[(unaff_RBP->field_0).op1].field_1.op12;
          pcStack_530 = (code *)0x1379c7;
          CVar16 = lj_ctype_info((CTState *)local_510.J[-1].penalty[0x3b].pc.ptr64,id,
                                 (CTSize *)&local_150.i);
          local_510.gcsteps = local_510.gcsteps + 1;
          pcStack_530 = (code *)0x1379e3;
          asm_setupresult(&local_510,unaff_RBP,lj_ir_callinfo + 0x2a);
          if ((unaff_RBP->field_1).o == 'T') {
            uVar54 = 0x80200;
            if (local_150.field_1.op12 != 8) {
              uVar54 = 0;
            }
            uVar5 = (unaff_RBP->field_0).op2;
            uVar30 = (ulong)uVar5;
            bVar50 = (byte)(uVar54 >> 0x10);
            if ((short)uVar5 < 0) {
              bVar14 = *(byte *)((long)local_510.ir + uVar30 * 8 + 6);
              RVar15 = (Reg)bVar14;
              if ((char)bVar14 < '\0') {
                pcStack_530 = (code *)0x139a28;
                RVar15 = ra_allocref(&local_510,(uint)uVar5,0xb028);
              }
              bVar14 = (byte)RVar15 & 0x1f;
              local_510.weakset = local_510.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
              local_510.mcp[-1] = 0x10;
              local_510.mcp[-2] = (byte)RVar15 * '\b' & 0x38 | 0x40;
              local_510.mcp[-3] = 0x89;
              uVar54 = (RVar15 | uVar54) >> 1 & 0x104;
              if (uVar54 == 0) {
                local_510.mcp = local_510.mcp + -3;
              }
              else {
                local_510.mcp[-4] = (byte)uVar54 | bVar50 | 0x40;
                local_510.mcp = local_510.mcp + -4;
              }
            }
            else {
              uVar24 = (uint)*(byte *)((long)local_510.ir + uVar30 * 8 + 5);
              if ((uVar24 < 0x1e) && ((0x26000000U >> (uVar24 & 0x1f) & 1) != 0)) {
                u64 = local_510.ir[uVar30 + 1];
              }
              else {
                u64.gcr.gcptr64._4_4_ = 0;
                u64.field_1.op12 = local_510.ir[uVar30].field_1.op12;
              }
              if ((local_150.field_1.op12 == 4) || ((long)u64 + 0x80000000U >> 0x20 == 0)) {
                *(int32_t *)(local_510.mcp + -4) = u64.i;
                local_510.mcp[-5] = 0x10;
                (local_510.mcp + -7)[0] = 199;
                (local_510.mcp + -7)[1] = 0x40;
                if ((uVar54 >> 9 & 1) == 0) {
                  local_510.mcp = local_510.mcp + -7;
                }
                else {
                  local_510.mcp[-8] = bVar50 | 0x40;
                  local_510.mcp = local_510.mcp + -8;
                }
              }
              else {
                local_510.mcp[-1] = 0x10;
                (local_510.mcp + -3)[0] = 0x89;
                (local_510.mcp + -3)[1] = 0x48;
                if ((uVar54 >> 9 & 1) == 0) {
                  local_510.mcp = local_510.mcp + -3;
                }
                else {
                  local_510.mcp[-4] = bVar50 | 0x40;
                  local_510.mcp = local_510.mcp + -4;
                }
                pcStack_530 = (code *)0x13a268;
                emit_loadu64(&local_510,1,(uint64_t)u64);
              }
            }
          }
          else if ((unaff_RBP->field_0).op2 != 0x7fff) {
            local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
            local_138.field_4.i = 0x7fff;
            local_138.u64._6_2_ = 0;
            local_12c = 0x7ffd;
            pcStack_530 = (code *)0x137c66;
            local_130 = (uint)(unaff_RBP->field_0).op2;
            asm_gencall(&local_510,lj_ir_callinfo + 0x65,(IRRef *)&local_138.u64);
            bVar50 = *(byte *)((long)local_510.ir + 0x3ffee);
            uVar54 = 1 << (bVar50 & 0x1f);
            local_510.modset = local_510.modset | uVar54;
            local_510.freeset = local_510.freeset | uVar54;
            *(undefined1 *)((long)local_510.ir + 0x3ffee) = 0xff;
            pcStack_530 = (code *)0x137ca3;
            emit_loadi(&local_510,(uint)bVar50,CVar16 >> 0x10 & 0xf);
            goto switchD_0013780f_caseD_c;
          }
          local_510.mcp[-1] = 8;
          (local_510.mcp + -3)[0] = 0x89;
          (local_510.mcp + -3)[1] = 0x48;
          *(CTypeID *)(local_510.mcp + -7) = id << 0x10 | 0xa00;
          (local_510.mcp + -9)[0] = 0x81;
          (local_510.mcp + -9)[1] = 0xc9;
          local_510.mcp[-10] = 3;
          (local_510.mcp + -0xc)[0] = 0x83;
          (local_510.mcp + -0xc)[1] = 0xe1;
          local_510.mcp = local_510.mcp + -0xc;
          pcStack_530 = (code *)0x13a3ce;
          emit_rma(&local_510,XO_MOVZXb,1,local_510.J[-1].penalty + 0x25);
          local_138.n = 6.95271921071662e-310;
          pcStack_530 = (code *)0x13a3f2;
          asm_gencall(&local_510,lj_ir_callinfo + 0x2a,(IRRef *)&local_138.u64);
          bVar50 = *(byte *)((long)local_510.ir + 0x3ffee);
          uVar54 = 1 << (bVar50 & 0x1f);
          local_510.modset = local_510.modset | uVar54;
          local_510.freeset = local_510.freeset | uVar54;
          *(undefined1 *)((long)local_510.ir + 0x3ffee) = 0xff;
          uVar54 = local_150.field_1.op12 + 0x10;
LAB_0013a424:
          pcStack_530 = (code *)0x13a42b;
          emit_loadi(&local_510,(uint)bVar50,uVar54);
          goto switchD_0013780f_caseD_c;
        case 'U':
          pcStack_530 = (code *)0x137e1c;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          IVar38 = (unaff_RBP->field_0).op2;
          if (IVar38 == 2) {
            pcStack_530 = (code *)0x139e92;
            RVar17 = ra_scratch(&local_510,~(1 << (RVar15 & 0x1f)) & 0xbfef);
            local_138.u64._4_2_ = 9;
            pcStack_530 = (code *)0x139eb5;
            emit_storeofs(&local_510,(IRIns *)&local_138,RVar17,RVar15,0x18);
            pcStack_530 = (code *)0x139ed9;
            emit_rma(&local_510,XO_OR,RVar17 | 0x80200,local_510.J[-1].penalty + 0x3a);
            local_510.mcp[-1] = 7;
            local_510.mcp[-2] = (byte)RVar17 & 7 | 0xe0;
            local_510.mcp[-3] = 0x83;
            if ((RVar17 & 8) == 0) {
              local_510.mcp = local_510.mcp + -3;
            }
            else {
              local_510.mcp[-4] = 0x41;
              local_510.mcp = local_510.mcp + -4;
            }
            iVar41 = 0x18;
LAB_0013a4cd:
            pcStack_530 = (code *)0x13a4d2;
            emit_loadofs(&local_510,(IRIns *)&local_138,RVar17,RVar15,iVar41);
          }
          else if (IVar38 == 1) {
            uVar5 = (unaff_RBP->field_0).op1;
            if (((*(char *)((long)local_510.ir + (ulong)uVar5 * 8 + 6) < '\0') &&
                (pIVar56 = local_510.ir + uVar5, pIVar56 != unaff_RBP + -1)) &&
               ((pIVar56 != unaff_RBP + -2 ||
                ((-1 < *(char *)((long)unaff_RBP + -2) || (*(char *)((long)unaff_RBP + -1) != '\0'))
                )))) {
              for (; ((pIVar56->field_1).o != 'U' || ((pIVar56->field_0).op2 != 0));
                  pIVar56 = local_510.ir + (pIVar56->field_0).op1) {
              }
              if (-1 < (short)(pIVar56->field_0).op1) {
                pcStack_530 = (code *)0x139e66;
                RVar17 = ra_allocref(&local_510,(uint)uVar5,0xbfef);
                local_510.weakset = local_510.weakset | 1 << ((byte)RVar17 & 0x1f);
                unaff_RBP = pIVar56;
              }
            }
          }
          else if (IVar38 == 0) {
            pcStack_530 = (code *)0x137e51;
            RVar17 = ra_scratch(&local_510,~(1 << (RVar15 & 0x1f)) & 0xbfef);
            local_138.u64._4_2_ = 9;
            pcStack_530 = (code *)0x137e76;
            emit_storeofs(&local_510,(IRIns *)&local_138,RVar17,RVar15,0);
            iVar41 = 0x10;
            goto LAB_0013a4cd;
          }
          pcStack_530 = (code *)0x13a4e2;
          ra_left(&local_510,RVar15,(uint)(unaff_RBP->field_0).op1);
          goto switchD_0013780f_caseD_c;
        case 'V':
          local_138.field_4.i = CONCAT22(0,(unaff_RBP->field_0).op1);
          local_138.u64._4_2_ = (unaff_RBP->field_0).op2;
          uVar30 = (ulong)(ushort)local_138.u64._4_2_;
          local_138.u64._6_2_ = 0;
          cVar3 = *(char *)((long)local_510.ir + uVar30 * 8 + 5);
          pCVar34 = lj_ir_callinfo + 0x11;
          local_528 = (int32_t)local_510.ir;
          if (cVar3 == '\x18') {
            iVar55 = -0x81;
            if (*(int *)((long)local_510.ir[uVar30 + 1] + 0x14) == 1) {
              iVar55 = (int)*(char *)((long)local_510.ir[uVar30 + 1] + 0x18);
              local_138.field_4.it = 0x7ffd;
              pCVar34 = lj_ir_callinfo + 0x12;
            }
          }
          else {
            iVar55 = -0x81;
            if ((local_510.fuseref < (ushort)local_138.u64._4_2_) &&
               (*(char *)((long)local_510.ir + uVar30 * 8 + 6) < '\0')) {
              if (cVar3 == 'O') {
                local_138.u64._4_2_ = local_510.ir[uVar30].field_0.op1;
                local_138.u64._6_2_ = 0;
                local_130 = (uint32_t)*(ushort *)((long)local_510.ir + uVar30 * 8 + 2);
                pCVar34 = lj_ir_callinfo + 0x10;
              }
              else if (cVar3 == ']') {
                sVar6 = *(short *)((long)local_510.ir + uVar30 * 8 + 2);
                if (sVar6 == 1) {
                  local_138.field_4.it = 0x7ffd;
                  pCVar34 = lj_ir_callinfo + 8;
                }
                else {
                  local_138.u64._4_2_ = local_510.ir[uVar30].field_0.op1;
                  local_138.u64._6_2_ = 0;
                  pCVar34 = lj_ir_callinfo + 0x12;
                  if (sVar6 == 0) {
                    pCVar34 = lj_ir_callinfo + 7;
                  }
                }
              }
            }
          }
          pcStack_530 = (code *)0x13945b;
          asm_setupresult(&local_510,unaff_RBP,pCVar34);
          pcStack_530 = (code *)0x139471;
          asm_gencall(&local_510,pCVar34,(IRRef *)&local_138.u64);
          if (local_138.field_4.it == 0x7ffd) {
            bVar50 = *(byte *)((long)local_510.ir + 0x3ffee);
            RVar15 = (Reg)bVar50;
            uVar54 = 1 << (bVar50 & 0x1f);
            local_510.modset = local_510.modset | uVar54;
            local_510.freeset = local_510.freeset | uVar54;
            *(undefined1 *)((long)local_510.ir + 0x3ffee) = 0xff;
            if (iVar55 == -0x81) {
              ref = (IRRef)*(ushort *)((long)local_528 + uVar30 * 8);
              goto LAB_0013971d;
            }
            pcStack_530 = (code *)0x139f15;
            emit_loadi(&local_510,(uint)bVar50,iVar55);
          }
          goto switchD_0013780f_caseD_c;
        case 'W':
          local_138.u64._2_2_ = 0;
          local_138.u64._0_2_ = (unaff_RBP->field_0).op1;
          local_138.field_4.it = TVar13.field_4.it;
          local_510.gcsteps = local_510.gcsteps + 1;
          pcStack_530 = (code *)0x13806b;
          asm_setupresult(&local_510,unaff_RBP,lj_ir_callinfo + 0x1e);
          pCVar34 = lj_ir_callinfo + 0x1e;
LAB_00138b7e:
          pcStack_530 = (code *)0x138b86;
          asm_gencall(&local_510,pCVar34,(IRRef *)&local_138.u64);
          goto switchD_0013780f_caseD_c;
        case 'X':
          bVar50 = *(byte *)((long)local_510.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
          RVar15 = (Reg)bVar50;
          if ((char)bVar50 < '\0') {
            pcStack_530 = (code *)0x138d37;
            RVar15 = ra_allocref(&local_510,(uint)(unaff_RBP->field_0).op1,0xbfef);
          }
          bVar50 = (byte)RVar15 & 0x1f;
          local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
          pcStack_530 = (code *)0x138d5e;
          RVar17 = ra_scratch(&local_510,~(1 << (RVar15 & 0x1f)) & 0xbfef);
          pMVar12 = local_510.mcp;
          uVar54 = RVar17 | 0x80200;
          unaff_RBP = (IRIns *)(ulong)uVar54;
          pcStack_530 = (code *)0x138d87;
          emit_rmro(&local_510,XO_MOVto,uVar54,RVar15,0x18);
          pcStack_530 = (code *)0x138dab;
          emit_rma(&local_510,XO_MOVto,RVar15 | 0x80200,local_510.J[-1].penalty + 0x27);
          pcStack_530 = (code *)0x138dc4;
          emit_rma(&local_510,XO_MOV,uVar54,local_510.J[-1].penalty + 0x27);
          local_510.mcp[-1] = 0xfb;
          pcStack_530 = (code *)0x138df4;
          local_510.mcp = local_510.mcp + -1;
          emit_rmro(&local_510,XO_ARITHib,4,RVar15,8);
          local_510.mcp[-1] = (char)pMVar12 - (char)local_510.mcp;
          local_510.mcp[-2] = 0x74;
          local_510.mcp[-3] = 4;
          pcStack_530 = (code *)0x138e2c;
          local_510.mcp = local_510.mcp + -3;
          emit_rmro(&local_510,XO_GROUP3b,0,RVar15,8);
          goto switchD_0013780f_caseD_c;
        case 'Y':
          pcStack_530 = (code *)0x137cba;
          ra_evictset(&local_510,0xffff0fc7);
          pMVar12 = local_510.mcp;
          local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
          local_138.field_4.i = 0x7ffd;
          local_138.u64._6_2_ = 0;
          pcStack_530 = (code *)0x137ce5;
          asm_gencall(&local_510,lj_ir_callinfo + 0x29,(IRRef *)&local_138.u64);
          bVar50 = *(byte *)((long)local_510.ir + 0x3ffee);
          uVar54 = 1 << (bVar50 & 0x1f);
          local_510.modset = local_510.modset | uVar54;
          local_510.freeset = local_510.freeset | uVar54;
          *(undefined1 *)((long)local_510.ir + 0x3ffee) = 0xff;
          pcStack_530 = (code *)0x137d27;
          emit_loadu64(&local_510,(uint)bVar50,(uint64_t)(local_510.J[-1].penalty + 0x23));
          bVar50 = *(byte *)((long)local_510.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6);
          local_510.mcp[-1] = (char)pMVar12 - (char)local_510.mcp;
          local_510.mcp[-2] = 0x74;
          pbVar33 = local_510.mcp + -3;
          local_510.mcp[-3] = 3;
          uVar5 = (unaff_RBP->field_0).op2;
          local_510.mcp = pbVar33;
          if ((short)uVar5 < 0) {
            bVar14 = *(byte *)((long)local_510.ir + (ulong)uVar5 * 8 + 6);
            RVar15 = (Reg)bVar14;
            if ((char)bVar14 < '\0') {
              pcStack_530 = (code *)0x139a9c;
              RVar15 = ra_allocref(&local_510,(uint)uVar5,~(1 << (bVar50 & 0x1f)) & 0xfc7);
            }
            bVar14 = (byte)RVar15 & 0x1f;
            local_510.weakset = local_510.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
            pcStack_530 = (code *)0x139ac2;
            emit_rmro(&local_510,XO_GROUP3b,0,RVar15,8);
          }
          else {
            pcStack_530 = (code *)0x137d87;
            emit_rma(&local_510,XO_GROUP3b,0,(void *)((long)local_510.ir[(ulong)uVar5 + 1] + 8));
          }
          local_510.mcp[-1] = (char)pMVar12 - (char)local_510.mcp;
          local_510.mcp[-2] = 0x74;
          local_510.mcp[-3] = 4;
          pcStack_530 = (code *)0x139afc;
          local_510.mcp = local_510.mcp + -3;
          emit_rmro(&local_510,XO_GROUP3b,0,(uint)bVar50,-8);
          goto switchD_0013780f_caseD_c;
        case '[':
          uVar24 = (unaff_RBP->field_0).op2 & 0x1f;
          uVar7 = (ushort)uVar24;
          uVar5 = (unaff_RBP->field_0).op1;
          IVar53.gcr.gcptr64._2_6_ = 0;
          IVar53.field_0.op1 = uVar5;
          bVar50 = (byte)(unaff_RBP->field_0).ot;
          uVar54 = bVar50 & 0x1f;
          if ((byte)((char)uVar54 - 0xdU) < 2) {
            local_528.field_0.op1._0_1_ = (ushort)(uVar7 - 0x15) < 2;
            pcStack_530 = (code *)0x138c59;
            RVar15 = ra_dest(&local_510,unaff_RBP,0xffff0000);
            if ((ushort)(uVar7 - 0xd) < 2) {
              pcStack_530 = (code *)0x138c86;
              RVar17 = asm_fuseload(&local_510,(uint)uVar5,0xffff0000);
              xVar35 = (uint)(uVar7 != 0xe) << 8 | XO_CVTSD2SS;
              unaff_RBP = (IRIns *)(ulong)xVar35;
              pcStack_530 = (code *)0x138ca0;
              emit_mrm(&local_510,xVar35,RVar15,RVar17);
              if (RVar17 == RVar15) goto switchD_0013780f_caseD_c;
            }
            else {
              bVar50 = uVar24 == 9 | local_528._0_1_;
              if ((uVar24 | 2) == 0x16) {
                bVar14 = *(byte *)((long)local_510.ir + (long)IVar53 * 8 + 6);
                RVar17 = (Reg)bVar14;
                if ((char)bVar14 < '\0') {
                  pcStack_530 = (code *)0x139f6c;
                  RVar17 = ra_allocref(&local_510,(uint)uVar5,0xbfef);
                }
                bVar14 = (byte)RVar17 & 0x1f;
                local_510.weakset =
                     local_510.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
              }
              else {
                pcStack_530 = (code *)0x13a6e3;
                RVar17 = asm_fuseloadm(&local_510,(uint)uVar5,0xbfef,(uint)bVar50);
              }
              pMVar12 = local_510.mcp;
              if (uVar7 == 0x16) {
                pcStack_530 = (code *)0x13a715;
                emit_rma(&local_510,XO_ADDSD,RVar15,(local_510.J)->k64 + 1);
                local_510.mcp[-1] = (char)pMVar12 - (char)local_510.mcp;
                local_510.mcp[-2] = 0x79;
                local_510.mcp[-3] = ((byte)RVar17 & 7) + (byte)RVar17 * '\b' | 0xc0;
                local_510.mcp[-4] = 0x85;
                local_510.mcp[-5] =
                     (byte)(RVar17 >> 0x10) | (byte)(RVar17 >> 1) & 4 | (byte)(RVar17 >> 3) & 1 |
                     0x48;
                local_510.mcp = local_510.mcp + -5;
              }
              uVar54 = (uint)bVar50;
              if (bVar50 != 0) {
                uVar54 = 0x80200;
              }
              if (uVar7 == 0x14) {
                uVar54 = 0x80200;
              }
              pcStack_530 = (code *)0x13a7b8;
              emit_mrm(&local_510,
                       (uint)(((unaff_RBP->field_1).t.irt & 0x1f) != 0xe) << 8 | XO_CVTSI2SD,
                       uVar54 | RVar15,RVar17);
            }
            local_510.mcp[-1] = ((byte)RVar15 & 7) + (byte)RVar15 * '\b' | 0xc0;
            (local_510.mcp + -3)[0] = 0xf;
            (local_510.mcp + -3)[1] = 0x57;
            uVar54 = RVar15 >> 3 & 1 | RVar15 >> 1 & 4;
            if (uVar54 == 0) {
              local_510.mcp = local_510.mcp + -3;
            }
            else {
              local_510.mcp[-4] = (byte)uVar54 | 0x40;
              local_510.mcp = local_510.mcp + -4;
            }
LAB_0013ab2e:
            goto switchD_0013780f_caseD_c;
          }
          if ((ushort)(uVar7 - 0xd) < 2) {
            if ((char)bVar50 < '\0') {
              bVar50 = *(byte *)((long)local_510.ir + (long)IVar53 * 8 + 6);
              RVar15 = (Reg)bVar50;
              if ((char)bVar50 < '\0') {
                pcStack_530 = (code *)0x13a65b;
                RVar15 = ra_allocref(&local_510,(uint)uVar5,0xffff0000);
              }
              bVar50 = (byte)RVar15 & 0x1f;
              local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
              pcStack_530 = (code *)0x13a679;
              asm_tointg(&local_510,unaff_RBP,RVar15);
              goto switchD_0013780f_caseD_c;
            }
            pcStack_530 = (code *)0x139772;
            local_528 = IVar53;
            RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
            xVar35 = (uint)(uVar7 != 0xe) << 8 | XO_CVTTSD2SI;
            bVar14 = (unaff_RBP->field_1).t.irt & 0x1f;
            bVar50 = (byte)RVar15;
            if (bVar14 == 0x14) {
              local_510.mcp[-1] = (bVar50 & 7) + bVar50 * '\b' | 0xc0;
              local_510.mcp[-2] = 0x8b;
              uVar54 = RVar15 >> 3 & 1 | RVar15 >> 1 & 4;
              if (uVar54 == 0) {
                local_510.mcp = local_510.mcp + -2;
              }
              else {
                local_510.mcp[-3] = (byte)uVar54 | 0x40;
                local_510.mcp = local_510.mcp + -3;
              }
            }
            else if (bVar14 == 0x16) {
              if (*(char *)((long)local_510.ir + (long)local_528 * 8 + 6) < '\0') {
                bVar14 = *(byte *)((long)local_510.ir + ((ulong)local_528 & 0xffffffff) * 8 + 6);
                RVar17 = (Reg)bVar14;
                if ((char)bVar14 < '\0') {
                  pcStack_530 = (code *)0x13af1d;
                  RVar17 = ra_allocref(&local_510,local_528.field_1.op12,0xffff0000);
                }
                bVar14 = (byte)RVar17 & 0x1f;
                local_510.weakset =
                     local_510.weakset & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14);
              }
              else {
                pcStack_530 = (code *)0x1397bf;
                RVar17 = ra_scratch(&local_510,0xffff0000);
              }
              pMVar12 = local_510.mcp;
              uVar54 = RVar15 | 0x80200;
              unaff_RBP = (IRIns *)(ulong)uVar54;
              pcStack_530 = (code *)0x13af50;
              emit_rr(&local_510,xVar35,uVar54,RVar17);
              lVar26 = 0x104;
              if (uVar7 == 0xe) {
                lVar26 = 0x140;
              }
              pcStack_530 = (code *)0x13af89;
              emit_rma(&local_510,(uint)(uVar7 != 0xe) << 8 | XO_ADDSD,RVar17,
                       (void *)((long)&((local_510.J)->cur).nextgc.gcptr64 + lVar26));
              local_510.mcp[-1] = (char)pMVar12 - (char)local_510.mcp;
              local_510.mcp[-2] = 0x79;
              local_510.mcp[-3] = (bVar50 & 7) + bVar50 * '\b' | 0xc0;
              local_510.mcp[-4] = 0x85;
              local_510.mcp[-5] = (byte)(RVar15 >> 3) & 1 | (byte)(RVar15 >> 1) & 4 | 0x48;
              local_510.mcp = local_510.mcp + -5;
              pcStack_530 = (code *)0x13aff2;
              emit_rr(&local_510,xVar35,uVar54,RVar17);
              pcStack_530 = (code *)0x13b000;
              ra_left(&local_510,RVar17,local_528.i);
              goto switchD_0013780f_caseD_c;
            }
            uVar54._0_2_ = *(IROpT *)((long)unaff_RBP + 4);
            uVar54._2_2_ = *(IRRef1 *)((long)unaff_RBP + 6);
            uVar24 = 0;
            if (((byte)(undefined2)uVar54 & 0x1f) == 0x14) {
              uVar24 = 0x80200;
            }
            if ((0x605fd9U >> (uVar54 & 0x1f) & 1) != 0) {
              uVar24 = 0x80200;
            }
            unaff_RBP = (IRIns *)(ulong)(uVar24 | RVar15);
            pcStack_530 = (code *)0x13b04a;
            RVar15 = asm_fuseload(&local_510,local_528.field_1.op12,0xffff0000);
LAB_0013b050:
            RVar17 = (Reg)unaff_RBP;
          }
          else {
            if ((ushort)(uVar7 - 0xf) < 4) {
              pcStack_530 = (code *)0x139fac;
              RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
              unaff_RBP = (IRIns *)(ulong)RVar15;
              if (uVar7 == 0x11) {
                xVar35 = XO_MOVSXw;
              }
              else if (uVar24 == 0x10) {
                unaff_RBP = (IRIns *)(ulong)(RVar15 | 0x200);
                xVar35 = XO_MOVZXb;
              }
              else if (uVar24 == 0xf) {
                unaff_RBP = (IRIns *)(ulong)(RVar15 | 0x200);
                xVar35 = XO_MOVSXb;
              }
              else {
                xVar35 = XO_MOVZXw;
              }
              pcStack_530 = (code *)0x13ad94;
              RVar15 = asm_fuseload(&local_510,(uint)uVar5,0xbfef);
              goto LAB_0013b050;
            }
            pcStack_530 = (code *)0x13a581;
            RVar17 = ra_dest(&local_510,unaff_RBP,0xbfef);
            if ((0x605fd9U >> uVar54 & 1) == 0) {
              if (((0x16 < uVar7) || ((0x600200U >> uVar24 & 1) == 0)) ||
                 (((unaff_RBP->field_0).op2 & 0x1000) != 0)) {
LAB_0013ab9b:
                pcStack_530 = (code *)0x13abab;
                ra_left(&local_510,RVar17,(uint)uVar5);
                goto switchD_0013780f_caseD_c;
              }
              pcStack_530 = (code *)0x13a5cb;
              RVar15 = asm_fuseload(&local_510,(uint)uVar5,0xbfef);
              xVar35 = XO_MOV;
            }
            else {
              if (((uVar7 < 0x17) && ((0x600200U >> uVar24 & 1) != 0)) ||
                 (((unaff_RBP->field_0).op2 & 0x800) == 0)) goto LAB_0013ab9b;
              pcStack_530 = (code *)0x13b0a3;
              RVar15 = asm_fuseload(&local_510,(uint)uVar5,0xbfef);
              RVar17 = RVar17 | 0x80200;
              xVar35 = XO_MOVSXd;
            }
          }
LAB_0013b052:
          pcStack_530 = (code *)0x13b059;
          emit_mrm(&local_510,xVar35,RVar17,RVar15);
          goto switchD_0013780f_caseD_c;
        case '\\':
          pcStack_530 = (code *)0x138150;
          RVar15 = ra_dest(&local_510,unaff_RBP,0xbfef);
          if (*(char *)((long)local_510.ir + (ulong)(unaff_RBP->field_0).op1 * 8 + 6) < '\0') {
            pcStack_530 = (code *)0x139b59;
            uVar54 = ra_allocref(&local_510,(uint)(unaff_RBP->field_0).op1,0xffff0000);
            bVar50 = (byte)uVar54 & 0x1f;
            local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
          }
          else {
            pcStack_530 = (code *)0x138178;
            uVar54 = ra_scratch(&local_510,0xffff0000);
          }
          local_510.mcp[-1] = ((byte)RVar15 & 7) + (char)uVar54 * '\b' | 0xc0;
          pbVar33 = local_510.mcp + -5;
          pbVar33[0] = 0xfc;
          pbVar33[1] = 0x66;
          pbVar33[2] = 0xf;
          pbVar33[3] = 0x7e;
          uVar24 = RVar15 >> 3 & 1 | uVar54 >> 1 & 4;
          if (uVar24 == 0) {
            local_510.mcp = local_510.mcp + -4;
          }
          else {
            local_510.mcp[-4] = (byte)uVar24 | 0x40;
            local_510.mcp[-5] = 0x66;
            local_510.mcp = local_510.mcp + -5;
          }
          pcStack_530 = (code *)0x139bd3;
          RVar15 = asm_fuseload(&local_510,(uint)(unaff_RBP->field_0).op2,
                                ~(1 << (uVar54 & 0x1f)) & 0xffff0000);
          pcStack_530 = (code *)0x139be4;
          emit_mrm(&local_510,XO_ADDSD,uVar54,RVar15);
          pcStack_530 = (code *)0x139bf2;
          ra_left(&local_510,uVar54,(uint)(unaff_RBP->field_0).op1);
          goto switchD_0013780f_caseD_c;
        case ']':
          pcStack_530 = (code *)0x138b98;
          asm_snap_prep(&local_510);
          local_510.gcsteps = local_510.gcsteps + 1;
          if ((unaff_RBP->field_0).op2 == 1) {
            local_138.n = 6.95271921071662e-310;
            pCVar34 = lj_ir_callinfo + 5;
          }
          else {
            local_138.u64._4_2_ = (unaff_RBP->field_0).op1;
            local_138.field_4.i = 0x7fff;
            local_138.u64._6_2_ = 0;
            pCVar34 = lj_ir_callinfo + (ulong)((unaff_RBP->field_0).op2 != 0) * 2 + 4;
          }
          pcStack_530 = (code *)0x1396ce;
          asm_setupresult(&local_510,unaff_RBP,pCVar34);
          pcStack_530 = (code *)0x1396e1;
          asm_gencall(&local_510,pCVar34,(IRRef *)&local_138.u64);
          if ((unaff_RBP->field_0).op2 == 1) {
            RVar15 = (Reg)*(byte *)((long)local_510.ir + 0x3ffee);
            uVar54 = 1 << (*(byte *)((long)local_510.ir + 0x3ffee) & 0x1f);
            local_510.modset = local_510.modset | uVar54;
            local_510.freeset = local_510.freeset | uVar54;
            *(undefined1 *)((long)local_510.ir + 0x3ffee) = 0xff;
            ref = (IRRef)(unaff_RBP->field_0).op1;
LAB_0013971d:
            pcStack_530 = (code *)0x139729;
            asm_tvptr(&local_510,RVar15,ref,1);
          }
          goto switchD_0013780f_caseD_c;
        case '^':
          pcStack_530 = (code *)0x138eec;
          ra_evictset(&local_510,0xffff0fc7);
          pcStack_530 = (code *)0x138ef9;
          asm_guardcc(&local_510,4);
          (local_510.mcp + -2)[0] = 0x85;
          (local_510.mcp + -2)[1] = 0xc0;
          local_510.mcp = local_510.mcp + -2;
          local_138.u64._2_2_ = 0;
          local_138.u64._0_2_ = (unaff_RBP->field_0).op1;
          local_138.field_4.it = 0x7ffd;
          pcStack_530 = (code *)0x138f35;
          asm_gencall(&local_510,lj_ir_callinfo + 3,(IRRef *)&local_138.u64);
          bVar50 = *(byte *)((long)local_510.ir + 0x3ffee);
          uVar54 = 1 << (bVar50 & 0x1f);
          local_510.modset = local_510.modset | uVar54;
          local_510.freeset = local_510.freeset | uVar54;
          *(undefined1 *)((long)local_510.ir + 0x3ffee) = 0xff;
          pcStack_530 = (code *)0x138f80;
          emit_rmro(&local_510,XO_LEA,bVar50 | 0x80200,4,(uint)(unaff_RBP->field_1).s << 2);
          goto switchD_0013780f_caseD_c;
        case '_':
        case 'a':
        case 'b':
          goto switchD_0013780f_caseD_5f;
        case '`':
          local_510.gcsteps = local_510.gcsteps + 1;
switchD_0013780f_caseD_5f:
          pCVar34 = lj_ir_callinfo + (unaff_RBP->field_0).op2;
          pcStack_530 = (code *)0x138a9d;
          asm_collectargs(&local_510,unaff_RBP,pCVar34,(IRRef *)&local_138.u64);
          pcStack_530 = (code *)0x138aab;
          asm_setupresult(&local_510,unaff_RBP,pCVar34);
          pcStack_530 = (code *)0x138ab9;
          asm_gencall(&local_510,pCVar34,(IRRef *)&local_138.u64);
          goto switchD_0013780f_caseD_c;
        case 'c':
          pcStack_530 = (code *)0x137d9c;
          local_148 = asm_callx_flags(&local_510,unaff_RBP);
          pcStack_530 = (code *)0x137dbe;
          asm_collectargs(&local_510,unaff_RBP,(CCallInfo *)&local_150.field_0,
                          (IRRef *)&local_138.u64);
          pcStack_530 = (code *)0x137dcc;
          asm_setupresult(&local_510,unaff_RBP,(CCallInfo *)&local_150.field_0);
          uVar30 = (ulong)(unaff_RBP->field_0).op2;
          pIVar56 = local_510.ir + uVar30;
          if ((pIVar56->field_1).o == 'd') {
            uVar30 = (ulong)(pIVar56->field_0).op1;
            pIVar56 = local_510.ir + uVar30;
          }
          if ((short)uVar30 < 0) {
LAB_00139c33:
            local_150 = (IRIns)0x0;
          }
          else {
            if ((pIVar56->field_1).o == '\x1d') {
              local_150 = pIVar56[1];
            }
            else {
              local_150.gcr.gcptr64._4_4_ = 0;
              local_150.field_1.op12 = (pIVar56->field_1).op12;
            }
            if ((long)(int)((long)local_150 - (long)local_510.mcp) !=
                (long)local_150 - (long)local_510.mcp) goto LAB_00139c33;
          }
          if (local_150 == (IRIns)0x0) {
            bVar50 = *(byte *)((long)local_510.ir + uVar30 * 8 + 6);
            RVar15 = (Reg)bVar50;
            if ((char)bVar50 < '\0') {
              pcStack_530 = (code *)0x139c63;
              RVar15 = ra_allocref(&local_510,(IRRef)uVar30,0xb028);
            }
            bVar50 = (byte)RVar15 & 0x1f;
            local_510.weakset = local_510.weakset & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
            local_510.mcp[-1] = (byte)RVar15 & 7 | 0xd0;
            local_510.mcp[-2] = 0xff;
            if ((RVar15 & 8) == 0) {
              local_510.mcp = local_510.mcp + -2;
            }
            else {
              local_510.mcp[-3] = 0x41;
              local_510.mcp = local_510.mcp + -3;
            }
          }
          pcStack_530 = (code *)0x13a090;
          asm_gencall(&local_510,(CCallInfo *)&local_150.field_0,(IRRef *)&local_138.u64);
          goto switchD_0013780f_caseD_c;
        }
        pcStack_530 = (code *)0x13a181;
        emit_mrm(&local_510,xVar35,RVar15,0x20);
      }
    } while( true );
  }
  goto LAB_0013bc67;
switchD_00136e5e_caseD_5f:
  uVar5 = (pIVar56->field_0).op2;
  pcStack_530 = (code *)0x136f29;
  RVar15 = asm_setup_call_slots(&local_510,pIVar56,lj_ir_callinfo + uVar5);
  (pIVar56->field_0).prev = (IRRef1)RVar15;
  if (bVar58) {
    local_510.modset =
         local_510.modset |
         (uint)((*(byte *)((long)&lj_ir_callinfo[uVar5].flags + 1) & 4) >> 2) * 0x10000 - 0xf039;
  }
LAB_001370b4:
  pIVar56 = pIVar56 + 1;
  if (pIVar21 <= pIVar56) goto LAB_001370c1;
  goto LAB_00136e23;
LAB_0013b192:
  if ((local_510.realign == (byte *)0x0) ||
     (J = local_160, local_160->curfinal->nins < local_158->nins)) {
    if (local_510.mcp < local_510.mclim) {
LAB_0013bc67:
      pcStack_530 = (code *)0x13bc71;
      asm_mclimit(&local_510);
    }
    if (0 < local_510.gcsteps) {
      local_510.curins = (IRRef)(local_510.T)->snap->ref;
      pcStack_530 = (code *)0x13b207;
      asm_snap_prep(&local_510);
      pcStack_530 = (code *)0x13b20f;
      asm_gc_check(&local_510);
      local_510.curins = local_510.stopins;
    }
    if (local_510.freeset < 0xffff0000) {
      uVar54 = ~local_510.freeset & 0xffff0000;
      do {
        uVar24 = 0;
        if (uVar54 != 0) {
          for (; (uVar54 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar47 = (uint)(ushort)local_510.cost[uVar24];
        if (uVar47 < 0x8000) {
          pcStack_530 = (code *)0x13b24e;
          ra_rematk(&local_510,uVar47);
          if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
        }
        bVar50 = (byte)uVar24 & 0x1f;
        uVar54 = uVar54 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
      } while (uVar54 != 0);
    }
    if ((local_510.freeset & 0xbfef) != 0xbfef) {
      uVar54 = local_510.freeset & 0xbfef ^ 0xbfef;
      do {
        uVar24 = 0;
        if (uVar54 != 0) {
          for (; (uVar54 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar47 = (uint)(ushort)local_510.cost[uVar24];
        if (uVar47 < 0x8000) {
          pcStack_530 = (code *)0x13b2a3;
          ra_rematk(&local_510,uVar47);
          if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
        }
        bVar50 = (byte)uVar24 & 0x1f;
        uVar54 = uVar54 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
      } while (uVar54 != 0);
    }
    if (local_510.parent != (GCtrace *)0x0) {
      local_180 = (local_510.parent)->ir;
      if ((local_510.snapno != 0) && ((local_510.parent)->topslot < local_510.topslot)) {
        pcStack_530 = (code *)0x13b306;
        asm_snap_alloc(&local_510,0);
      }
      bVar50 = *(byte *)((long)local_510.ir + 0x40006);
      uVar54 = 0x80;
      if (-1 < (char)bVar50) {
        uVar54 = (uint)bVar50;
        uVar24 = local_510.freeset | 1 << (uVar54 & 0x1f);
        local_510.freeset = uVar24;
        if (((local_510.modset >> (uVar54 & 0x1f) & 1) != 0) ||
           ((*(byte *)((long)local_510.ir + 0x40004) & 0x20) != 0)) {
          *(undefined1 *)((long)local_510.ir + 0x40006) = 0xff;
        }
        bVar14 = *(byte *)((long)local_180 + 0x40006);
        if (bVar14 != bVar50) {
          if (((char)bVar14 < '\0') || ((uVar24 >> (bVar14 & 0x1f) & 1) == 0)) {
            pcStack_530 = (code *)0x13b502;
            emit_rma(&local_510,XO_MOV,uVar54 | 0x80200,&local_510.J[-1].penalty[0x3a].val);
            uVar54 = 0x80;
          }
          else {
            local_510.mcp[-1] = bVar14 & 7 | bVar50 * '\b' | 0xc0;
            local_510.mcp[-2] = 0x8b;
            local_510.mcp[-3] = bVar14 >> 3 & 1 | bVar50 >> 1 & 4 | 0x48;
            local_510.mcp = local_510.mcp + -3;
            uVar54 = (uint)*(byte *)((long)local_180 + 0x40006);
          }
        }
      }
      bVar50 = (byte)uVar54 & 0x1f;
      uVar52 = -2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50;
      uVar24 = uVar52 & 0xbfef;
      if (uVar54 == 0x80) {
        uVar24 = 0xbfef;
      }
      if (uVar54 == 0x80) {
        uVar52 = 0xffffbfef;
      }
      uVar30 = (ulong)local_510.stopins;
      if (uVar30 < 0x8001) {
        local_51c = 0;
        bVar58 = true;
        local_520 = 0;
      }
      else {
        local_528.field_1.op12 = uVar52;
        puVar49 = auStack_1037a + uVar30;
        lVar26 = uVar30 << 3;
        local_520 = 0;
        local_178 = (IRIns *)((ulong)local_178 & 0xffffffff00000000);
        local_51c = 0;
        do {
          pIVar56 = local_510.ir;
          pIVar21 = (IRIns *)((long)local_510.ir + lVar26);
          uVar5 = *puVar49;
          bVar50 = *(byte *)((long)local_510.ir + lVar26 + 6);
          if ((char)bVar50 < '\0') {
            if (*(char *)((long)local_510.ir + lVar26 + 7) != '\0') {
              pbVar33 = (byte *)((long)local_510.ir + lVar26 + 4);
              *pbVar33 = *pbVar33 | 0x20;
              local_178 = (IRIns *)CONCAT44(local_178._4_4_,1);
            }
          }
          else {
            local_528.field_1.op12 = local_528._0_4_ & ~(1 << (bVar50 & 0x1f));
            bVar14 = *(byte *)((long)local_510.ir + lVar26 + 7);
            if (bVar14 != 0) {
              local_518 = CONCAT44(local_518._4_4_,uVar24);
              pcStack_530 = (code *)0x13b5c2;
              emit_storeofs(&local_510,pIVar21,(uint)bVar50,4,(uint)bVar14 << 2);
              uVar24 = (uint)local_518;
              if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
            }
          }
          bVar50 = (pIVar21->field_1).r;
          if (bVar50 == uVar5) {
            local_510.freeset = local_510.freeset | 1 << (bVar50 & 0x1f);
          }
          else if (uVar5 < 0x100) {
            if ((-1 < (char)bVar50) || (*(char *)((long)pIVar56 + lVar26 + 7) != '\0')) {
              *(short *)((long)&local_138 + (ulong)uVar5 * 2) = (short)uVar30;
              local_520 = local_520 | 1 << (uVar5 & 0x1f);
            }
          }
          else if (-1 < (char)bVar50) {
            local_51c = 1;
          }
          bVar50 = (byte)uVar5 & 0x1f;
          uVar54 = -2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50;
          if (0xff < uVar5) {
            uVar54 = 0xffffffff;
          }
          uVar24 = uVar24 & uVar54;
          uVar54 = (int)uVar30 - 1;
          uVar30 = (ulong)uVar54;
          puVar49 = puVar49 + -1;
          lVar26 = lVar26 + -8;
        } while (0x8000 < uVar54);
        bVar58 = (int)local_178 == 0;
        uVar52 = local_528._0_4_;
      }
      local_518 = CONCAT44(local_518._4_4_,uVar24);
      uVar54 = local_510.evenspill * 4 + 4U & 0xfffffff0;
      if (local_510.evenspill < 3) {
        uVar54 = 0;
      }
      local_16c = uVar54 - (local_510.parent)->spadjust;
      local_168 = 0;
      if (0 < (int)local_16c) {
        local_168 = (ulong)local_16c;
      }
      if ((int)local_16c < 0) {
        uVar54 = (uint)(local_510.parent)->spadjust;
      }
      (local_510.T)->spadjust = (uint16_t)uVar54;
      uVar54 = local_520;
      if ((!bVar58) && (uVar30 = (ulong)local_510.stopins, 0x8000 < uVar30)) {
        puVar49 = auStack_1037a + uVar30;
        lVar26 = uVar30 << 3;
        do {
          pIVar56 = local_510.ir;
          bVar50 = *(byte *)((long)local_510.ir + lVar26 + 4);
          if ((bVar50 & 0x20) != 0) {
            *(byte *)((long)local_510.ir + lVar26 + 4) = bVar50 & 0xdf;
            uVar5 = *puVar49;
            if (uVar5 < 0x100) {
              *(byte *)((long)local_510.ir + lVar26 + 6) = (byte)uVar5 | 0x80;
            }
            else if ((int)local_168 + (uint)(uVar5 >> 8) * 4 ==
                     (uint)*(byte *)((long)local_510.ir + lVar26 + 7) << 2) goto LAB_0013b856;
            uVar24 = 0xffff0000;
            if (1 < (byte)((*(byte *)((long)local_510.ir + lVar26 + 4) & 0x1f) - 0xd)) {
              uVar24 = 0xbfef;
            }
            local_528.field_1.op12 = uVar52;
            local_520 = uVar54;
            if ((uVar24 & uVar52) == 0) goto LAB_0013be45;
            local_178 = (IRIns *)((long)local_510.ir + lVar26);
            pcStack_530 = (code *)0x13b7d0;
            RVar15 = ra_allocref(&local_510,(IRRef)uVar30,uVar24 & uVar52);
            pcStack_530 = (code *)0x13b7f6;
            emit_storeofs(&local_510,local_178,RVar15,4,
                          (uint)*(byte *)((long)pIVar56 + lVar26 + 7) << 2);
            bVar50 = (byte)RVar15 & 0x1f;
            if (RVar15 == uVar5) {
              local_510.freeset = local_510.freeset | 1 << ((byte)RVar15 & 0x1f);
              uVar54 = local_520 & (-2 << bVar50 | 0xfffffffeU >> 0x20 - bVar50);
            }
            else {
              uVar54 = local_520;
              if (0xff < uVar5) {
                local_51c = 1;
              }
            }
            if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
            uVar52 = local_528._0_4_ & ~(1 << (RVar15 & 0x1f));
          }
LAB_0013b856:
          uVar24 = (IRRef)uVar30 - 1;
          uVar30 = (ulong)uVar24;
          puVar49 = puVar49 + -1;
          lVar26 = lVar26 + -8;
        } while (0x8000 < uVar24);
      }
      *(uint *)(local_510.mcp + -4) = (uint)(local_510.T)->traceno;
      local_510.mcp = local_510.mcp + -4;
      pcStack_530 = (code *)0x13b8b5;
      emit_rma(&local_510,XO_MOVmi,0,&local_510.J[-1].penalty[0x2e].val);
      if (0 < (int)local_16c) {
        if ((int)local_16c < 0x81) {
          local_510.mcp[-1] = (byte)-(int)local_168;
          local_510.mcp = local_510.mcp + -1;
          uVar25 = 0x830000fe;
        }
        else {
          *(int *)(local_510.mcp + -4) = -(int)local_168;
          local_510.mcp = local_510.mcp + -4;
          uVar25 = 0x810000fe;
        }
        local_510.mcp[-1] = 0xc4;
        *(undefined4 *)(local_510.mcp + -5) = uVar25;
        local_510.mcp[-3] = 0x48;
        local_510.mcp = local_510.mcp + -3;
      }
      if (local_51c != 0) {
        if ((local_510.freeset & 0xffffbfef) != 0xffffbfef) {
          uVar24 = local_510.freeset & 0xffffbfef ^ 0xffffbfef;
          do {
            uVar47 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
              }
            }
            uVar5 = (ushort)local_510.cost[uVar47];
            if (0xff < local_510.parentmap[uVar5 - 0x8001]) {
              local_510.freeset = local_510.freeset | 1 << ((byte)uVar47 & 0x1f);
              pcStack_530 = (code *)0x13b981;
              emit_loadofs(&local_510,local_510.ir + uVar5,uVar47,4,
                           local_510.parentmap[uVar5 - 0x8001] >> 6 & 0xfffffffc);
              if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
            }
            uVar24 = uVar24 & ~(1 << (uVar47 & 0x1f));
          } while (uVar24 != 0);
        }
      }
      local_180 = local_180 + 0x8000;
      do {
        uVar24 = uVar54 & 0xbfef;
        local_528.field_1.op12 = uVar52;
        local_520 = 0;
        if ((uVar54 & 0xbfef) != 0) {
          for (; (uVar24 >> local_520 & 1) == 0; local_520 = local_520 + 1) {
          }
        }
        uVar47 = uVar54 & 0xffff0000;
        RVar15 = 0;
        if ((uVar54 & 0xffff0000) != 0) {
          for (; (uVar47 >> RVar15 & 1) == 0; RVar15 = RVar15 + 1) {
          }
        }
        while( true ) {
          uVar45 = local_510.freeset & uVar54;
          if (uVar45 != 0) break;
          if (uVar54 == 0) {
            bVar50 = (local_510.parent)->topslot;
            (local_510.T)->topslot = bVar50;
            if (bVar50 < local_510.topslot) {
              exitno = (local_510.J)->exitno;
              (local_510.T)->topslot = (uint8_t)local_510.topslot;
              pcStack_530 = (code *)0x13bafc;
              asm_stack_check(&local_510,local_510.topslot,local_180,(uint)local_518,exitno);
            }
            goto LAB_0013bb39;
          }
          if (uVar24 != 0) {
            uVar45 = local_510.freeset & (uVar24 ^ 0xbfef) & uVar52;
            if (uVar45 == 0) goto LAB_0013be45;
            RVar17 = 0;
            if (uVar45 != 0) {
              for (; (uVar45 >> RVar17 & 1) == 0; RVar17 = RVar17 + 1) {
              }
            }
            pcStack_530 = (code *)0x13ba14;
            ra_rename(&local_510,local_520,RVar17);
          }
          if (uVar47 != 0) {
            uVar45 = local_510.freeset & (uVar47 ^ 0xffff0000) & local_528._0_4_;
            if (uVar45 == 0) goto LAB_0013be45;
            RVar17 = 0;
            if (uVar45 != 0) {
              for (; (uVar45 >> RVar17 & 1) == 0; RVar17 = RVar17 + 1) {
              }
            }
            pcStack_530 = (code *)0x13ba3e;
            ra_rename(&local_510,RVar15,RVar17);
          }
          if (local_510.mcp < local_510.mclim) goto LAB_0013bc67;
        }
        uVar24 = 0;
        if (uVar45 != 0) {
          for (; (uVar45 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        pIVar56 = local_510.ir + *(ushort *)((long)&local_138 + (ulong)uVar24 * 2);
        uVar54 = uVar54 & ~(1 << (uVar24 & 0x1f));
        uVar52 = local_528._0_4_ & ~(1 << (uVar24 & 0x1f));
        local_510.freeset = local_510.freeset | 1 << ((pIVar56->field_1).r & 0x1f);
        pcStack_530 = (code *)0x13ba96;
        emit_movrr(&local_510,pIVar56,(uint)(pIVar56->field_1).r,uVar24);
      } while (local_510.mclim <= local_510.mcp);
      goto LAB_0013bc67;
    }
    bVar50 = *(byte *)((long)local_510.ir + 0x40006);
    if (-1 < (char)bVar50) {
      local_510.freeset = local_510.freeset | 1 << (bVar50 & 0x1f);
      if (((local_510.modset >> ((int)(char)bVar50 & 0x1fU) & 1) != 0) ||
         ((*(byte *)((long)local_510.ir + 0x40004) & 0x20) != 0)) {
        *(undefined1 *)((long)local_510.ir + 0x40006) = 0xff;
      }
      if (bVar50 != 2) {
        local_510.mcp[-1] = bVar50 * '\b' | 0xc2;
        local_510.mcp[-2] = 0x8b;
        local_510.mcp[-3] = bVar50 >> 1 & 4 | 0x48;
        local_510.mcp = local_510.mcp + -3;
      }
    }
    *(uint *)(local_510.mcp + -4) = (uint)(local_510.T)->traceno;
    local_510.mcp = local_510.mcp + -4;
    pcStack_530 = (code *)0x13b425;
    emit_rma(&local_510,XO_MOVmi,0,&local_510.J[-1].penalty[0x2e].val);
    uVar54 = local_510.evenspill * 4 + 4U & 0xfffffff0;
    if (local_510.evenspill < 3) {
      uVar54 = 0;
    }
    (local_510.T)->spadjust = (uint16_t)uVar54;
    if (uVar54 != 0) {
      if (uVar54 + 0x7f < 0x100) {
        local_510.mcp[-1] = (byte)-uVar54;
        local_510.mcp = local_510.mcp + -1;
        uVar52 = 0x830000fe;
      }
      else {
        *(uint *)(local_510.mcp + -4) = -uVar54;
        local_510.mcp = local_510.mcp + -4;
        uVar52 = 0x810000fe;
      }
      local_510.mcp[-1] = 0xc4;
      *(undefined4 *)(local_510.mcp + -5) = uVar52;
      local_510.mcp[-3] = 0x48;
      local_510.mcp = local_510.mcp + -3;
    }
    (local_510.T)->topslot = *(uint8_t *)(((local_510.T)->startpt).gcptr64 + 0xb);
LAB_0013bb39:
    J = local_160;
    pGVar20 = local_158;
    for (uVar54 = local_510.phiset; unaff_RBP = (IRIns *)(ulong)uVar54, local_160 = J,
        local_158 = pGVar20, uVar54 != 0;
        uVar54 = uVar54 & (-2 << bVar14 | 0xfffffffeU >> 0x20 - bVar14)) {
      uVar47 = uVar54 >> 0x18 | (uVar54 & 0xff0000) >> 8 | (uVar54 & 0xff00) << 8 | uVar54 << 0x18;
      uVar24 = 0x1f;
      if (uVar47 != 0) {
        for (; uVar47 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar5 = local_510.phireg[uVar24 ^ 0x18];
      uVar30 = (ulong)uVar5;
      bVar50 = *(byte *)((long)local_510.ir + uVar30 * 8 + 4);
      bVar14 = (byte)(uVar24 ^ 0x18);
      if (((bVar50 & 0x20) != 0) &&
         (*(byte *)((long)local_510.ir + uVar30 * 8 + 4) = bVar50 & 0xdf,
         *(char *)((long)local_510.ir + uVar30 * 8 + 7) != '\0')) {
        ((local_510.J)->fold).ins.field_0.ot = 0x1400;
        ((local_510.J)->fold).ins.field_0.op1 = uVar5;
        ((local_510.J)->fold).ins.field_0.op2 = (IRRef1)local_510.loopsnapno;
        pcStack_530 = (code *)0x13bba5;
        TVar18 = lj_ir_emit(local_510.J);
        uVar30 = (ulong)((TVar18 & 0xffff) << 3);
        *(byte *)((long)((local_510.J)->cur).ir + uVar30 + 6) = bVar14;
        *(undefined1 *)((long)((local_510.J)->cur).ir + uVar30 + 7) = 0;
      }
      bVar14 = bVar14 & 0x1f;
      J = local_160;
      pGVar20 = local_158;
    }
    T_00 = J->curfinal;
    if (pGVar20->nins <= T_00->nins) {
      pcStack_530 = (code *)0x13bc99;
      memcpy(T_00->ir + local_510.orignins,pGVar20->ir + local_510.orignins,
             (ulong)(pGVar20->nins - local_510.orignins) << 3);
      pGVar20->nins = J->curfinal->nins;
      local_510.curins = 0x8001;
      pcStack_530 = (code *)0x13bcb6;
      asm_snap_prev(&local_510);
      if (local_510.freeset == 0xffffbfef) {
        pGVar20->mcode = local_510.mcp;
        MVar19 = 0;
        if (local_510.mcloop != (byte *)0x0) {
          MVar19 = (int)local_510.mcloop - (int)local_510.mcp;
        }
        pGVar20->mcloop = MVar19;
        pbVar33 = local_510.mctop;
        if (local_510.loopref == 0) {
          uVar5 = pGVar20->link;
          uVar7 = (local_510.T)->spadjust;
          if (uVar7 == 0) {
            pbVar33 = local_510.mctop + -7;
          }
          else {
            if ((uint)uVar7 == (int)(char)(byte)uVar7) {
              local_510.mctop[-9] = (byte)uVar7;
              bVar50 = 0x83;
              pbVar33 = local_510.mctop + -3;
            }
            else {
              *(uint *)(local_510.mctop + -9) = (uint)uVar7;
              bVar50 = 0x81;
            }
            local_510.mctop[-0xc] = 0x48;
            local_510.mctop[-0xb] = bVar50;
            local_510.mctop[-10] = 0xc4;
          }
          if ((ulong)uVar5 == 0) {
            iVar55 = 0x12f515;
          }
          else {
            iVar55 = (int)*(undefined8 *)((local_510.J)->trace[uVar5].gcptr64 + 0x58);
          }
          *(int *)(pbVar33 + -4) = iVar55 - (int)pbVar33;
          pbVar33[-5] = 0xe9;
          if (pbVar33 <= local_510.mctop + -1) {
            pbVar32 = local_510.mctop + -2;
            if (pbVar33 + -1 < local_510.mctop + -2) {
              pbVar32 = pbVar33 + -1;
            }
            pcStack_530 = (code *)0x13bda5;
            memset(pbVar32 + 1,0x90,(size_t)(local_510.mctop + ~(ulong)pbVar32));
          }
        }
        local_510.mctop = pbVar33;
        pGVar20->szmcode = (int)local_510.mctop - (int)local_510.mcp;
        pSVar8 = (local_510.T)->snap;
        uVar54 = (local_510.T)->nsnap - 1;
        if (uVar54 != 0) {
          uVar30 = (ulong)uVar54;
          puVar27 = &pSVar8[uVar30].mcofs;
          do {
            uVar30 = uVar30 - 1;
            *puVar27 = ((short)local_510.mctoporig - (short)local_510.mcp) -
                       pSVar8[uVar30 & 0xffffffff].mcofs;
            puVar27 = puVar27 + -6;
          } while ((int)uVar30 != 0);
        }
        pSVar8->mcofs = 0;
        pcStack_530 = (code *)0x13be26;
        lj_mcode_sync(pGVar20->mcode,local_510.mctoporig);
        return;
      }
      pcStack_530 = asm_snap_prev;
      lj_trace_err(local_510.J,LJ_TRERR_BADRA);
    }
    pcStack_530 = (code *)0x13bc07;
    lj_trace_free(local_140,T_00);
    J->curfinal = (GCtrace *)0x0;
    pcStack_530 = (code *)0x13bc1c;
    pGVar20 = lj_trace_alloc(J->L,pGVar20);
    J->curfinal = pGVar20;
    local_510.realign = (byte *)0x0;
  }
  goto LAB_00136b7b;
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;
#ifdef LUAJIT_RANDOM_RA
  (void)lj_prng_u64(&J2G(J)->prng);  /* Ensure PRNG step between traces. */
#endif

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;
#ifdef LUAJIT_RANDOM_RA
    as->prngstate = J2G(J)->prng;  /* Must (re)start from identical state. */
    as->prngbits = 0;
#endif

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (as->loopref)
    asm_loop_tail_fixup(as);
  else
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}